

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined6 uVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  int iVar61;
  undefined4 uVar62;
  ulong uVar63;
  ulong uVar64;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *extraout_RAX_01;
  RayHit *extraout_RAX_02;
  RayHit *pRVar65;
  undefined4 uVar67;
  RayHit *extraout_RAX_03;
  RayHit *extraout_RAX_04;
  RayHit *extraout_RAX_05;
  RayHit *extraout_RAX_06;
  RayHit *pRVar66;
  RTCIntersectArguments *pRVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  long lVar72;
  long lVar73;
  bool bVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  short sVar79;
  undefined2 uVar119;
  float fVar80;
  uint uVar81;
  float fVar120;
  float fVar122;
  __m128 a_1;
  uint uVar121;
  uint uVar123;
  uint uVar124;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar125;
  float fVar152;
  float fVar153;
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar167;
  float fVar168;
  vfloat4 v;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar184;
  float fVar185;
  vfloat4 v_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar186;
  float fVar203;
  float fVar204;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar227;
  float fVar228;
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar229;
  float fVar232;
  float fVar233;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar247;
  float fVar248;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar249;
  float fVar260;
  float fVar261;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar262;
  float fVar272;
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar274;
  float fVar281;
  float fVar282;
  undefined1 auVar275 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar283;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar295;
  float fVar296;
  float fVar305;
  float fVar307;
  float fVar309;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar301 [16];
  float fVar306;
  float fVar308;
  float fVar310;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar311;
  float fVar312;
  float fVar315;
  float fVar316;
  vfloat4 a;
  float fVar317;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar318;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  undefined4 local_5ac;
  undefined1 local_5a8 [16];
  RTCIntersectArguments *local_590;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  ulong local_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  RTCFilterFunctionNArguments local_4e8;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  ulong local_490;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  float fStack_450;
  float fStack_44c;
  undefined4 local_448;
  uint local_444;
  uint local_440;
  uint local_43c;
  uint local_438;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  float local_2c8 [4];
  float local_2b8 [4];
  Primitive *local_2a8;
  ulong local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 uVar118;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  
  PVar18 = prim[1];
  uVar63 = (ulong)(byte)PVar18;
  lVar73 = uVar63 * 0x25;
  pPVar9 = prim + lVar73 + 6;
  fVar168 = *(float *)(pPVar9 + 0xc);
  fVar169 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar9) * fVar168;
  fVar184 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar9 + 4)) * fVar168;
  fVar185 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar9 + 8)) * fVar168;
  fVar154 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar167 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar168 = fVar168 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar67 = *(undefined4 *)(prim + uVar63 * 4 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar64;
  auVar82._12_2_ = uVar119;
  auVar82._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar156._12_4_ = auVar82._12_4_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar64;
  auVar156._10_2_ = uVar119;
  auVar267._10_6_ = auVar156._10_6_;
  auVar267._8_2_ = uVar119;
  auVar267._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar40._4_8_ = auVar267._8_8_;
  auVar40._2_2_ = uVar119;
  auVar40._0_2_ = uVar119;
  fVar311 = (float)((int)sVar79 >> 8);
  fVar315 = (float)(auVar40._0_4_ >> 0x18);
  fVar316 = (float)(auVar267._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 5 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar128._8_4_ = 0;
  auVar128._0_8_ = uVar64;
  auVar128._12_2_ = uVar119;
  auVar128._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar127._12_4_ = auVar128._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar64;
  auVar127._10_2_ = uVar119;
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._8_2_ = uVar119;
  auVar126._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar41._4_8_ = auVar126._8_8_;
  auVar41._2_2_ = uVar119;
  auVar41._0_2_ = uVar119;
  fVar186 = (float)((int)sVar79 >> 8);
  fVar203 = (float)(auVar41._0_4_ >> 0x18);
  fVar204 = (float)(auVar126._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 6 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar64;
  auVar131._12_2_ = uVar119;
  auVar131._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar64;
  auVar130._10_2_ = uVar119;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._8_2_ = uVar119;
  auVar129._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar42._4_8_ = auVar129._8_8_;
  auVar42._2_2_ = uVar119;
  auVar42._0_2_ = uVar119;
  fVar229 = (float)((int)sVar79 >> 8);
  fVar232 = (float)(auVar42._0_4_ >> 0x18);
  fVar233 = (float)(auVar129._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0xf + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar134._8_4_ = 0;
  auVar134._0_8_ = uVar64;
  auVar134._12_2_ = uVar119;
  auVar134._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar64;
  auVar133._10_2_ = uVar119;
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._8_2_ = uVar119;
  auVar132._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar43._4_8_ = auVar132._8_8_;
  auVar43._2_2_ = uVar119;
  auVar43._0_2_ = uVar119;
  fVar80 = (float)((int)sVar79 >> 8);
  fVar120 = (float)(auVar43._0_4_ >> 0x18);
  fVar122 = (float)(auVar132._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar64;
  auVar208._12_2_ = uVar119;
  auVar208._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar64;
  auVar207._10_2_ = uVar119;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar119;
  auVar206._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar44._4_8_ = auVar206._8_8_;
  auVar44._2_2_ = uVar119;
  auVar44._0_2_ = uVar119;
  fVar234 = (float)((int)sVar79 >> 8);
  fVar247 = (float)(auVar44._0_4_ >> 0x18);
  fVar248 = (float)(auVar206._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar63 + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar64;
  auVar211._12_2_ = uVar119;
  auVar211._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar64;
  auVar210._10_2_ = uVar119;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar119;
  auVar209._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar45._4_8_ = auVar209._8_8_;
  auVar45._2_2_ = uVar119;
  auVar45._0_2_ = uVar119;
  fVar262 = (float)((int)sVar79 >> 8);
  fVar272 = (float)(auVar45._0_4_ >> 0x18);
  fVar273 = (float)(auVar209._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1a + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar64;
  auVar214._12_2_ = uVar119;
  auVar214._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar64;
  auVar213._10_2_ = uVar119;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar119;
  auVar212._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar46._4_8_ = auVar212._8_8_;
  auVar46._2_2_ = uVar119;
  auVar46._0_2_ = uVar119;
  fVar249 = (float)((int)sVar79 >> 8);
  fVar260 = (float)(auVar46._0_4_ >> 0x18);
  fVar261 = (float)(auVar212._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1b + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar64;
  auVar217._12_2_ = uVar119;
  auVar217._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar64;
  auVar216._10_2_ = uVar119;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar119;
  auVar215._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar47._4_8_ = auVar215._8_8_;
  auVar47._2_2_ = uVar119;
  auVar47._0_2_ = uVar119;
  fVar274 = (float)((int)sVar79 >> 8);
  fVar281 = (float)(auVar47._0_4_ >> 0x18);
  fVar282 = (float)(auVar215._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1c + 6);
  uVar118 = (undefined1)((uint)uVar67 >> 0x18);
  uVar119 = CONCAT11(uVar118,uVar118);
  uVar118 = (undefined1)((uint)uVar67 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar119,uVar118),CONCAT14(uVar118,uVar67));
  uVar118 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar118),uVar118);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar64;
  auVar220._12_2_ = uVar119;
  auVar220._14_2_ = uVar119;
  uVar119 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar64;
  auVar219._10_2_ = uVar119;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar119;
  auVar218._0_8_ = uVar64;
  uVar119 = (undefined2)uVar39;
  auVar48._4_8_ = auVar218._8_8_;
  auVar48._2_2_ = uVar119;
  auVar48._0_2_ = uVar119;
  fVar125 = (float)((int)sVar79 >> 8);
  fVar152 = (float)(auVar48._0_4_ >> 0x18);
  fVar153 = (float)(auVar218._8_4_ >> 0x18);
  fVar295 = fVar154 * fVar311 + fVar167 * fVar186 + fVar168 * fVar229;
  fVar305 = fVar154 * fVar315 + fVar167 * fVar203 + fVar168 * fVar232;
  fVar307 = fVar154 * fVar316 + fVar167 * fVar204 + fVar168 * fVar233;
  fVar309 = fVar154 * (float)(auVar156._12_4_ >> 0x18) +
            fVar167 * (float)(auVar127._12_4_ >> 0x18) + fVar168 * (float)(auVar130._12_4_ >> 0x18);
  fVar283 = fVar154 * fVar80 + fVar167 * fVar234 + fVar168 * fVar262;
  fVar292 = fVar154 * fVar120 + fVar167 * fVar247 + fVar168 * fVar272;
  fVar293 = fVar154 * fVar122 + fVar167 * fVar248 + fVar168 * fVar273;
  fVar294 = fVar154 * (float)(auVar133._12_4_ >> 0x18) +
            fVar167 * (float)(auVar207._12_4_ >> 0x18) + fVar168 * (float)(auVar210._12_4_ >> 0x18);
  fVar205 = fVar154 * fVar249 + fVar167 * fVar274 + fVar168 * fVar125;
  fVar227 = fVar154 * fVar260 + fVar167 * fVar281 + fVar168 * fVar152;
  fVar228 = fVar154 * fVar261 + fVar167 * fVar282 + fVar168 * fVar153;
  fVar168 = fVar154 * (float)(auVar213._12_4_ >> 0x18) +
            fVar167 * (float)(auVar216._12_4_ >> 0x18) + fVar168 * (float)(auVar219._12_4_ >> 0x18);
  fVar312 = fVar311 * fVar169 + fVar186 * fVar184 + fVar229 * fVar185;
  fVar315 = fVar315 * fVar169 + fVar203 * fVar184 + fVar232 * fVar185;
  fVar316 = fVar316 * fVar169 + fVar204 * fVar184 + fVar233 * fVar185;
  fVar317 = (float)(auVar156._12_4_ >> 0x18) * fVar169 +
            (float)(auVar127._12_4_ >> 0x18) * fVar184 + (float)(auVar130._12_4_ >> 0x18) * fVar185;
  fVar262 = fVar80 * fVar169 + fVar234 * fVar184 + fVar262 * fVar185;
  fVar272 = fVar120 * fVar169 + fVar247 * fVar184 + fVar272 * fVar185;
  fVar273 = fVar122 * fVar169 + fVar248 * fVar184 + fVar273 * fVar185;
  fVar311 = (float)(auVar133._12_4_ >> 0x18) * fVar169 +
            (float)(auVar207._12_4_ >> 0x18) * fVar184 + (float)(auVar210._12_4_ >> 0x18) * fVar185;
  fVar249 = fVar169 * fVar249 + fVar184 * fVar274 + fVar185 * fVar125;
  fVar260 = fVar169 * fVar260 + fVar184 * fVar281 + fVar185 * fVar152;
  fVar261 = fVar169 * fVar261 + fVar184 * fVar282 + fVar185 * fVar153;
  fVar274 = fVar169 * (float)(auVar213._12_4_ >> 0x18) +
            fVar184 * (float)(auVar216._12_4_ >> 0x18) + fVar185 * (float)(auVar219._12_4_ >> 0x18);
  uVar81 = (uint)DAT_01fec6c0;
  uVar121 = DAT_01fec6c0._4_4_;
  uVar123 = DAT_01fec6c0._8_4_;
  uVar124 = DAT_01fec6c0._12_4_;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar295 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar305 & uVar121));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar307 & uVar123));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar309 & uVar124));
  auVar297._0_4_ = (uint)fVar295 & uVar75;
  auVar297._4_4_ = (uint)fVar305 & uVar76;
  auVar297._8_4_ = (uint)fVar307 & uVar77;
  auVar297._12_4_ = (uint)fVar309 & uVar78;
  auVar170._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar170._8_4_ = ~uVar77 & 0x219392ef;
  auVar170._12_4_ = ~uVar78 & 0x219392ef;
  auVar170 = auVar170 | auVar297;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar283 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar292 & uVar121));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar293 & uVar123));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar294 & uVar124));
  auVar284._0_4_ = (uint)fVar283 & uVar75;
  auVar284._4_4_ = (uint)fVar292 & uVar76;
  auVar284._8_4_ = (uint)fVar293 & uVar77;
  auVar284._12_4_ = (uint)fVar294 & uVar78;
  auVar230._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar230._8_4_ = ~uVar77 & 0x219392ef;
  auVar230._12_4_ = ~uVar78 & 0x219392ef;
  auVar230 = auVar230 | auVar284;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar205 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar227 & uVar121));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar228 & uVar123));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar168 & uVar124));
  auVar221._0_4_ = (uint)fVar205 & uVar75;
  auVar221._4_4_ = (uint)fVar227 & uVar76;
  auVar221._8_4_ = (uint)fVar228 & uVar77;
  auVar221._12_4_ = (uint)fVar168 & uVar78;
  auVar235._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar235._8_4_ = ~uVar77 & 0x219392ef;
  auVar235._12_4_ = ~uVar78 & 0x219392ef;
  auVar235 = auVar235 | auVar221;
  auVar82 = rcpps(_DAT_01fec6c0,auVar170);
  fVar168 = auVar82._0_4_;
  fVar122 = auVar82._4_4_;
  fVar186 = auVar82._8_4_;
  fVar234 = auVar82._12_4_;
  fVar168 = (1.0 - auVar170._0_4_ * fVar168) * fVar168 + fVar168;
  fVar122 = (1.0 - auVar170._4_4_ * fVar122) * fVar122 + fVar122;
  fVar186 = (1.0 - auVar170._8_4_ * fVar186) * fVar186 + fVar186;
  fVar234 = (1.0 - auVar170._12_4_ * fVar234) * fVar234 + fVar234;
  auVar82 = rcpps(auVar82,auVar230);
  fVar80 = auVar82._0_4_;
  fVar125 = auVar82._4_4_;
  fVar203 = auVar82._8_4_;
  fVar247 = auVar82._12_4_;
  fVar80 = (1.0 - auVar230._0_4_ * fVar80) * fVar80 + fVar80;
  fVar125 = (1.0 - auVar230._4_4_ * fVar125) * fVar125 + fVar125;
  fVar203 = (1.0 - auVar230._8_4_ * fVar203) * fVar203 + fVar203;
  fVar247 = (1.0 - auVar230._12_4_ * fVar247) * fVar247 + fVar247;
  auVar82 = rcpps(auVar82,auVar235);
  fVar120 = auVar82._0_4_;
  fVar152 = auVar82._4_4_;
  fVar204 = auVar82._8_4_;
  fVar248 = auVar82._12_4_;
  fVar120 = (1.0 - auVar235._0_4_ * fVar120) * fVar120 + fVar120;
  fVar152 = (1.0 - auVar235._4_4_ * fVar152) * fVar152 + fVar152;
  fVar204 = (1.0 - auVar235._8_4_ * fVar204) * fVar204 + fVar204;
  fVar248 = (1.0 - auVar235._12_4_ * fVar248) * fVar248 + fVar248;
  fVar281 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar73 + 0x16)) *
            *(float *)(prim + lVar73 + 0x1a);
  uVar64 = *(ulong *)(prim + uVar63 * 7 + 6);
  uVar119 = (undefined2)(uVar64 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar64;
  auVar84._12_2_ = uVar119;
  auVar84._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar64 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar64;
  auVar83._10_2_ = uVar119;
  auVar269._10_6_ = auVar83._10_6_;
  auVar269._8_2_ = uVar119;
  auVar269._0_8_ = uVar64;
  uVar119 = (undefined2)(uVar64 >> 0x10);
  auVar49._4_8_ = auVar269._8_8_;
  auVar49._2_2_ = uVar119;
  auVar49._0_2_ = uVar119;
  fVar153 = (float)(auVar49._0_4_ >> 0x10);
  fVar205 = (float)(auVar269._8_4_ >> 0x10);
  uVar69 = *(ulong *)(prim + uVar63 * 0xb + 6);
  uVar119 = (undefined2)(uVar69 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar69;
  auVar173._12_2_ = uVar119;
  auVar173._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar69 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar69;
  auVar172._10_2_ = uVar119;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar119;
  auVar171._0_8_ = uVar69;
  uVar119 = (undefined2)(uVar69 >> 0x10);
  auVar50._4_8_ = auVar171._8_8_;
  auVar50._2_2_ = uVar119;
  auVar50._0_2_ = uVar119;
  uVar10 = *(ulong *)(prim + uVar63 * 9 + 6);
  uVar119 = (undefined2)(uVar10 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar10;
  auVar87._12_2_ = uVar119;
  auVar87._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar10 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar10;
  auVar86._10_2_ = uVar119;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar119;
  auVar85._0_8_ = uVar10;
  uVar119 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar85._8_8_;
  auVar51._2_2_ = uVar119;
  auVar51._0_2_ = uVar119;
  fVar154 = (float)(auVar51._0_4_ >> 0x10);
  fVar227 = (float)(auVar85._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar63 * 0xd + 6);
  uVar119 = (undefined2)(uVar11 >> 0x30);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar11;
  auVar238._12_2_ = uVar119;
  auVar238._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar11 >> 0x20);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar11;
  auVar237._10_2_ = uVar119;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._8_2_ = uVar119;
  auVar236._0_8_ = uVar11;
  uVar119 = (undefined2)(uVar11 >> 0x10);
  auVar52._4_8_ = auVar236._8_8_;
  auVar52._2_2_ = uVar119;
  auVar52._0_2_ = uVar119;
  uVar12 = *(ulong *)(prim + uVar63 * 0x12 + 6);
  uVar119 = (undefined2)(uVar12 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar12;
  auVar90._12_2_ = uVar119;
  auVar90._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar12 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar12;
  auVar89._10_2_ = uVar119;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar119;
  auVar88._0_8_ = uVar12;
  uVar119 = (undefined2)(uVar12 >> 0x10);
  auVar53._4_8_ = auVar88._8_8_;
  auVar53._2_2_ = uVar119;
  auVar53._0_2_ = uVar119;
  fVar167 = (float)(auVar53._0_4_ >> 0x10);
  fVar228 = (float)(auVar88._8_4_ >> 0x10);
  uVar71 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar63 * 2 + uVar71 + 6);
  uVar119 = (undefined2)(uVar13 >> 0x30);
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar13;
  auVar265._12_2_ = uVar119;
  auVar265._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar13 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar13;
  auVar264._10_2_ = uVar119;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar119;
  auVar263._0_8_ = uVar13;
  uVar119 = (undefined2)(uVar13 >> 0x10);
  auVar54._4_8_ = auVar263._8_8_;
  auVar54._2_2_ = uVar119;
  auVar54._0_2_ = uVar119;
  uVar71 = *(ulong *)(prim + uVar71 + 6);
  uVar119 = (undefined2)(uVar71 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar71;
  auVar93._12_2_ = uVar119;
  auVar93._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar71 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar71;
  auVar92._10_2_ = uVar119;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar119;
  auVar91._0_8_ = uVar71;
  uVar119 = (undefined2)(uVar71 >> 0x10);
  auVar55._4_8_ = auVar91._8_8_;
  auVar55._2_2_ = uVar119;
  auVar55._0_2_ = uVar119;
  fVar169 = (float)(auVar55._0_4_ >> 0x10);
  fVar229 = (float)(auVar91._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar63 * 0x18 + 6);
  uVar119 = (undefined2)(uVar14 >> 0x30);
  auVar277._8_4_ = 0;
  auVar277._0_8_ = uVar14;
  auVar277._12_2_ = uVar119;
  auVar277._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar14 >> 0x20);
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._8_2_ = 0;
  auVar276._0_8_ = uVar14;
  auVar276._10_2_ = uVar119;
  auVar275._10_6_ = auVar276._10_6_;
  auVar275._8_2_ = uVar119;
  auVar275._0_8_ = uVar14;
  uVar119 = (undefined2)(uVar14 >> 0x10);
  auVar56._4_8_ = auVar275._8_8_;
  auVar56._2_2_ = uVar119;
  auVar56._0_2_ = uVar119;
  uVar15 = *(ulong *)(prim + uVar63 * 0x1d + 6);
  uVar119 = (undefined2)(uVar15 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar15;
  auVar96._12_2_ = uVar119;
  auVar96._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar15 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar15;
  auVar95._10_2_ = uVar119;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar119;
  auVar94._0_8_ = uVar15;
  uVar119 = (undefined2)(uVar15 >> 0x10);
  auVar57._4_8_ = auVar94._8_8_;
  auVar57._2_2_ = uVar119;
  auVar57._0_2_ = uVar119;
  fVar184 = (float)(auVar57._0_4_ >> 0x10);
  fVar232 = (float)(auVar94._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar119 = (undefined2)(uVar16 >> 0x30);
  auVar287._8_4_ = 0;
  auVar287._0_8_ = uVar16;
  auVar287._12_2_ = uVar119;
  auVar287._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar16 >> 0x20);
  auVar286._12_4_ = auVar287._12_4_;
  auVar286._8_2_ = 0;
  auVar286._0_8_ = uVar16;
  auVar286._10_2_ = uVar119;
  auVar285._10_6_ = auVar286._10_6_;
  auVar285._8_2_ = uVar119;
  auVar285._0_8_ = uVar16;
  uVar119 = (undefined2)(uVar16 >> 0x10);
  auVar58._4_8_ = auVar285._8_8_;
  auVar58._2_2_ = uVar119;
  auVar58._0_2_ = uVar119;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar63) + 6);
  uVar119 = (undefined2)(uVar17 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar17;
  auVar99._12_2_ = uVar119;
  auVar99._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar17 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar17;
  auVar98._10_2_ = uVar119;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar119;
  auVar97._0_8_ = uVar17;
  uVar119 = (undefined2)(uVar17 >> 0x10);
  auVar59._4_8_ = auVar97._8_8_;
  auVar59._2_2_ = uVar119;
  auVar59._0_2_ = uVar119;
  fVar185 = (float)(auVar59._0_4_ >> 0x10);
  fVar233 = (float)(auVar97._8_4_ >> 0x10);
  uVar63 = *(ulong *)(prim + uVar63 * 0x23 + 6);
  uVar119 = (undefined2)(uVar63 >> 0x30);
  auVar300._8_4_ = 0;
  auVar300._0_8_ = uVar63;
  auVar300._12_2_ = uVar119;
  auVar300._14_2_ = uVar119;
  uVar119 = (undefined2)(uVar63 >> 0x20);
  auVar299._12_4_ = auVar300._12_4_;
  auVar299._8_2_ = 0;
  auVar299._0_8_ = uVar63;
  auVar299._10_2_ = uVar119;
  auVar298._10_6_ = auVar299._10_6_;
  auVar298._8_2_ = uVar119;
  auVar298._0_8_ = uVar63;
  uVar119 = (undefined2)(uVar63 >> 0x10);
  auVar60._4_8_ = auVar298._8_8_;
  auVar60._2_2_ = uVar119;
  auVar60._0_2_ = uVar119;
  auVar174._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar153) * fVar281 + fVar153) - fVar315) *
                fVar122,((((float)(int)(short)uVar69 - (float)(int)(short)uVar64) * fVar281 +
                         (float)(int)(short)uVar64) - fVar312) * fVar168);
  auVar174._8_4_ =
       ((((float)(auVar171._8_4_ >> 0x10) - fVar205) * fVar281 + fVar205) - fVar316) * fVar186;
  auVar174._12_4_ =
       ((((float)(auVar172._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar317) * fVar234;
  auVar239._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar281 +
        (float)(int)(short)uVar10) - fVar312) * fVar168;
  auVar239._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar154) * fVar281 + fVar154) - fVar315) * fVar122;
  auVar239._8_4_ =
       ((((float)(auVar236._8_4_ >> 0x10) - fVar227) * fVar281 + fVar227) - fVar316) * fVar186;
  auVar239._12_4_ =
       ((((float)(auVar237._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar317) * fVar234;
  auVar266._0_8_ =
       CONCAT44(((((float)(auVar54._0_4_ >> 0x10) - fVar167) * fVar281 + fVar167) - fVar272) *
                fVar125,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar281 +
                         (float)(int)(short)uVar12) - fVar262) * fVar80);
  auVar266._8_4_ =
       ((((float)(auVar263._8_4_ >> 0x10) - fVar228) * fVar281 + fVar228) - fVar273) * fVar203;
  auVar266._12_4_ =
       ((((float)(auVar264._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar311) * fVar247;
  auVar278._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar71) * fVar281 +
        (float)(int)(short)uVar71) - fVar262) * fVar80;
  auVar278._4_4_ =
       ((((float)(auVar56._0_4_ >> 0x10) - fVar169) * fVar281 + fVar169) - fVar272) * fVar125;
  auVar278._8_4_ =
       ((((float)(auVar275._8_4_ >> 0x10) - fVar229) * fVar281 + fVar229) - fVar273) * fVar203;
  auVar278._12_4_ =
       ((((float)(auVar276._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar311) * fVar247;
  auVar288._0_8_ =
       CONCAT44(((((float)(auVar58._0_4_ >> 0x10) - fVar184) * fVar281 + fVar184) - fVar260) *
                fVar152,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar281 +
                         (float)(int)(short)uVar15) - fVar249) * fVar120);
  auVar288._8_4_ =
       ((((float)(auVar285._8_4_ >> 0x10) - fVar232) * fVar281 + fVar232) - fVar261) * fVar204;
  auVar288._12_4_ =
       ((((float)(auVar286._12_4_ >> 0x10) - (float)(auVar95._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar95._12_4_ >> 0x10)) - fVar274) * fVar248;
  auVar301._0_4_ =
       ((((float)(int)(short)uVar63 - (float)(int)(short)uVar17) * fVar281 +
        (float)(int)(short)uVar17) - fVar249) * fVar120;
  auVar301._4_4_ =
       ((((float)(auVar60._0_4_ >> 0x10) - fVar185) * fVar281 + fVar185) - fVar260) * fVar152;
  auVar301._8_4_ =
       ((((float)(auVar298._8_4_ >> 0x10) - fVar233) * fVar281 + fVar233) - fVar261) * fVar204;
  auVar301._12_4_ =
       ((((float)(auVar299._12_4_ >> 0x10) - (float)(auVar98._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar98._12_4_ >> 0x10)) - fVar274) * fVar248;
  auVar155._8_4_ = auVar174._8_4_;
  auVar155._0_8_ = auVar174._0_8_;
  auVar155._12_4_ = auVar174._12_4_;
  auVar156 = minps(auVar155,auVar239);
  auVar100._8_4_ = auVar266._8_4_;
  auVar100._0_8_ = auVar266._0_8_;
  auVar100._12_4_ = auVar266._12_4_;
  auVar82 = minps(auVar100,auVar278);
  auVar156 = maxps(auVar156,auVar82);
  auVar101._8_4_ = auVar288._8_4_;
  auVar101._0_8_ = auVar288._0_8_;
  auVar101._12_4_ = auVar288._12_4_;
  auVar82 = minps(auVar101,auVar301);
  uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar135._4_4_ = uVar67;
  auVar135._0_4_ = uVar67;
  auVar135._8_4_ = uVar67;
  auVar135._12_4_ = uVar67;
  auVar82 = maxps(auVar82,auVar135);
  auVar82 = maxps(auVar156,auVar82);
  auVar156 = maxps(auVar174,auVar239);
  auVar267 = maxps(auVar266,auVar278);
  auVar156 = minps(auVar156,auVar267);
  local_248 = auVar82._0_4_ * 0.99999964;
  fStack_244 = auVar82._4_4_ * 0.99999964;
  fStack_240 = auVar82._8_4_ * 0.99999964;
  fStack_23c = auVar82._12_4_ * 0.99999964;
  auVar82 = maxps(auVar288,auVar301);
  fVar168 = (ray->super_RayK<1>).tfar;
  auVar102._4_4_ = fVar168;
  auVar102._0_4_ = fVar168;
  auVar102._8_4_ = fVar168;
  auVar102._12_4_ = fVar168;
  auVar82 = minps(auVar82,auVar102);
  auVar82 = minps(auVar156,auVar82);
  uVar75 = (uint)(byte)PVar18;
  auVar136._0_4_ = -(uint)(uVar75 != 0 && local_248 <= auVar82._0_4_ * 1.0000004);
  auVar136._4_4_ = -(uint)(1 < uVar75 && fStack_244 <= auVar82._4_4_ * 1.0000004);
  auVar136._8_4_ = -(uint)(2 < uVar75 && fStack_240 <= auVar82._8_4_ * 1.0000004);
  auVar136._12_4_ = -(uint)(3 < uVar75 && fStack_23c <= auVar82._12_4_ * 1.0000004);
  uVar75 = movmskps(uVar75,auVar136);
  if (uVar75 == 0) {
    return;
  }
  uVar75 = uVar75 & 0xff;
  local_218._0_12_ = mm_lookupmask_ps._240_12_;
  local_218._12_4_ = 0;
  local_2a8 = prim;
LAB_00bb7a09:
  local_2a0 = (ulong)uVar75;
  lVar73 = 0;
  if (local_2a0 != 0) {
    for (; (uVar75 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
    }
  }
  local_590 = (RTCIntersectArguments *)(ulong)*(uint *)(local_2a8 + 2);
  local_500 = (ulong)*(uint *)(local_2a8 + lVar73 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[(long)local_590].ptr;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           local_500 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_4f8 = pGVar19->fnumTimeSegments;
  fVar168 = (pGVar19->time_range).lower;
  fVar168 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar168) /
            ((pGVar19->time_range).upper - fVar168)) * local_4f8;
  _local_558 = ZEXT416((uint)fVar168);
  fVar168 = floorf(fVar168);
  if (local_4f8 + -1.0 <= fVar168) {
    fVar168 = local_4f8 + -1.0;
  }
  fVar80 = 0.0;
  if (0.0 <= fVar168) {
    fVar80 = fVar168;
  }
  fVar125 = (float)local_558._0_4_ - fVar80;
  fVar153 = 1.0 - fVar125;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)fVar80 * 0x38;
  lVar73 = *(long *)(_Var20 + lVar72);
  lVar21 = *(long *)(_Var20 + 0x10 + lVar72);
  lVar70 = lVar21 * (uVar64 + 2);
  pRVar68 = (RTCIntersectArguments *)(lVar21 * (uVar64 + 3));
  lVar22 = *(long *)(_Var20 + 0x38 + lVar72);
  lVar72 = *(long *)(_Var20 + 0x48 + lVar72);
  pfVar1 = (float *)(lVar22 + uVar64 * lVar72);
  pfVar2 = (float *)(lVar73 + lVar21 * uVar64);
  local_4f8 = *pfVar2 * fVar153 + *pfVar1 * fVar125;
  fStack_4f4 = pfVar2[1] * fVar153 + pfVar1[1] * fVar125;
  fStack_4f0 = pfVar2[2] * fVar153 + pfVar1[2] * fVar125;
  pfVar3 = (float *)(lVar22 + (uVar64 + 1) * lVar72);
  pfVar4 = (float *)(lVar73 + lVar21 * (uVar64 + 1));
  local_468 = *pfVar4 * fVar153 + *pfVar3 * fVar125;
  fStack_464 = pfVar4[1] * fVar153 + pfVar3[1] * fVar125;
  fStack_460 = pfVar4[2] * fVar153 + pfVar3[2] * fVar125;
  pfVar5 = (float *)(lVar22 + (uVar64 + 2) * lVar72);
  pfVar6 = (float *)(lVar73 + lVar70);
  local_478 = *pfVar6 * fVar153 + *pfVar5 * fVar125;
  fStack_474 = pfVar6[1] * fVar153 + pfVar5[1] * fVar125;
  fStack_470 = pfVar6[2] * fVar153 + pfVar5[2] * fVar125;
  pfVar7 = (float *)(lVar22 + lVar72 * (uVar64 + 3));
  pfVar8 = (float *)((long)&pRVar68->flags + lVar73);
  local_1d8 = fVar153 * *pfVar8 + fVar125 * *pfVar7;
  local_1e8 = fVar153 * pfVar8[1] + fVar125 * pfVar7[1];
  local_1f8 = fVar153 * pfVar8[2] + fVar125 * pfVar7[2];
  fVar168 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar80 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar120 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_2e8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_3e8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_338 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar122 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_11c = local_2e8 * local_2e8;
  fVar154 = local_3e8 * local_3e8;
  fVar167 = local_338 * local_338;
  fVar122 = fVar122 * fVar122;
  fVar152 = fStack_11c + fVar154 + fVar167;
  auVar187._0_8_ = CONCAT44(fVar154 + fVar154 + fVar122,fVar152);
  auVar187._8_4_ = fVar167 + fVar154 + fVar167;
  auVar187._12_4_ = fVar122 + fVar154 + fVar122;
  auVar175._8_4_ = auVar187._8_4_;
  auVar175._0_8_ = auVar187._0_8_;
  auVar175._12_4_ = auVar187._12_4_;
  auVar82 = rcpss(auVar175,auVar187);
  local_3b8 = (2.0 - fVar152 * auVar82._0_4_) * auVar82._0_4_ *
              (((fStack_4f0 + fStack_460 + fStack_470 + local_1f8) * 0.25 - fVar120) * local_338 +
              ((fStack_4f4 + fStack_464 + fStack_474 + local_1e8) * 0.25 - fVar80) * local_3e8 +
              ((local_4f8 + local_468 + local_478 + local_1d8) * 0.25 - fVar168) * local_2e8);
  local_2d8 = ZEXT416((uint)local_3b8);
  fStack_3b4 = local_3b8;
  fStack_3b0 = local_3b8;
  fStack_3ac = local_3b8;
  fVar168 = local_2e8 * local_3b8 + fVar168;
  fVar80 = local_3e8 * local_3b8 + fVar80;
  fVar120 = local_338 * local_3b8 + fVar120;
  local_4f8 = local_4f8 - fVar168;
  fStack_4f4 = fStack_4f4 - fVar80;
  fStack_4f0 = fStack_4f0 - fVar120;
  fStack_4ec = (pfVar2[3] * fVar153 + pfVar1[3] * fVar125) - 0.0;
  local_478 = local_478 - fVar168;
  fStack_474 = fStack_474 - fVar80;
  fStack_470 = fStack_470 - fVar120;
  fStack_46c = (pfVar6[3] * fVar153 + pfVar5[3] * fVar125) - 0.0;
  local_468 = local_468 - fVar168;
  fStack_464 = fStack_464 - fVar80;
  fStack_460 = fStack_460 - fVar120;
  fStack_45c = (pfVar4[3] * fVar153 + pfVar3[3] * fVar125) - 0.0;
  local_1d8 = local_1d8 - fVar168;
  local_1e8 = local_1e8 - fVar80;
  local_1f8 = local_1f8 - fVar120;
  fStack_54c = (fVar153 * pfVar8[3] + fVar125 * pfVar7[3]) - 0.0;
  local_138 = local_4f8;
  fStack_134 = local_4f8;
  fStack_130 = local_4f8;
  fStack_12c = local_4f8;
  local_148 = fStack_4f4;
  fStack_144 = fStack_4f4;
  fStack_140 = fStack_4f4;
  fStack_13c = fStack_4f4;
  local_158 = fStack_4f0;
  fStack_154 = fStack_4f0;
  fStack_150 = fStack_4f0;
  fStack_14c = fStack_4f0;
  local_168 = fStack_4ec;
  fStack_164 = fStack_4ec;
  fStack_160 = fStack_4ec;
  fStack_15c = fStack_4ec;
  local_178 = local_468;
  fStack_174 = local_468;
  fStack_170 = local_468;
  fStack_16c = local_468;
  local_188 = fStack_464;
  fStack_184 = fStack_464;
  fStack_180 = fStack_464;
  fStack_17c = fStack_464;
  local_198 = fStack_460;
  fStack_194 = fStack_460;
  fStack_190 = fStack_460;
  fStack_18c = fStack_460;
  local_128 = fStack_11c + fVar167 + fVar154;
  fStack_124 = fStack_11c + fVar167 + fVar154;
  fStack_120 = fStack_11c + fVar167 + fVar154;
  fStack_11c = fStack_11c + fVar167 + fVar154;
  local_1a8 = fStack_45c;
  fStack_1a4 = fStack_45c;
  fStack_1a0 = fStack_45c;
  fStack_19c = fStack_45c;
  local_1b8 = local_478;
  fStack_1b4 = local_478;
  fStack_1b0 = local_478;
  fStack_1ac = local_478;
  local_1c8 = fStack_474;
  fStack_1c4 = fStack_474;
  fStack_1c0 = fStack_474;
  fStack_1bc = fStack_474;
  local_278 = fStack_470;
  fStack_274 = fStack_470;
  fStack_270 = fStack_470;
  fStack_26c = fStack_470;
  local_288 = fStack_46c;
  fStack_284 = fStack_46c;
  fStack_280 = fStack_46c;
  fStack_27c = fStack_46c;
  fStack_1d4 = local_1d8;
  fStack_1d0 = local_1d8;
  fStack_1cc = local_1d8;
  fStack_1e4 = local_1e8;
  fStack_1e0 = local_1e8;
  fStack_1dc = local_1e8;
  fStack_1f4 = local_1f8;
  fStack_1f0 = local_1f8;
  fStack_1ec = local_1f8;
  local_558._4_4_ = local_1e8;
  local_558._0_4_ = local_1d8;
  fStack_550 = local_1f8;
  local_208 = fStack_54c;
  fStack_204 = fStack_54c;
  fStack_200 = fStack_54c;
  fStack_1fc = fStack_54c;
  fStack_2e4 = local_2e8;
  fStack_2e0 = local_2e8;
  fStack_2dc = local_2e8;
  fStack_3e4 = local_3e8;
  fStack_3e0 = local_3e8;
  fStack_3dc = local_3e8;
  fStack_334 = local_338;
  fStack_330 = local_338;
  fStack_32c = local_338;
  local_298 = ABS(local_128);
  fStack_294 = ABS(fStack_124);
  fStack_290 = ABS(fStack_120);
  fStack_28c = ABS(fStack_11c);
  uVar64 = 1;
  local_490 = 1;
  fVar168 = 0.0;
  fVar80 = 1.0;
  uVar67 = 0;
  uVar62 = 0;
  uVar69 = 0;
  do {
    local_388 = fVar80 - fVar168;
    local_3f8 = fVar168;
    fStack_3f4 = fVar80;
    uStack_3f0 = uVar67;
    uStack_3ec = uVar62;
    fStack_384 = local_388;
    fStack_380 = local_388;
    fStack_37c = local_388;
    local_398 = fVar168;
    fStack_394 = fVar168;
    fStack_390 = fVar168;
    fStack_38c = fVar168;
    fVar120 = local_388 * 0.0 + fVar168;
    fVar122 = local_388 * 0.33333334 + fVar168;
    fVar125 = local_388 * 0.6666667 + fVar168;
    fVar152 = local_388 * 1.0 + fVar168;
    fVar274 = (float)DAT_01feca10;
    fVar261 = fVar274 - fVar120;
    fVar282 = DAT_01feca10._4_4_;
    fVar281 = fVar282 - fVar122;
    fVar283 = DAT_01feca10._8_4_;
    fVar294 = DAT_01feca10._12_4_;
    fVar292 = fVar283 - fVar125;
    fVar293 = fVar294 - fVar152;
    fVar153 = local_178 * fVar261 + local_1b8 * fVar120;
    fVar305 = fStack_174 * fVar281 + fStack_1b4 * fVar122;
    fVar307 = fStack_170 * fVar292 + fStack_1b0 * fVar125;
    fVar309 = fStack_16c * fVar293 + fStack_1ac * fVar152;
    fVar312 = local_188 * fVar261 + local_1c8 * fVar120;
    fVar315 = fStack_184 * fVar281 + fStack_1c4 * fVar122;
    fVar316 = fStack_180 * fVar292 + fStack_1c0 * fVar125;
    fVar317 = fStack_17c * fVar293 + fStack_1bc * fVar152;
    fVar80 = local_198 * fVar261 + local_278 * fVar120;
    fVar154 = fStack_194 * fVar281 + fStack_274 * fVar122;
    fVar167 = fStack_190 * fVar292 + fStack_270 * fVar125;
    fVar169 = fStack_18c * fVar293 + fStack_26c * fVar152;
    fVar273 = local_1a8 * fVar261 + local_288 * fVar120;
    fVar311 = fStack_1a4 * fVar281 + fStack_284 * fVar122;
    fVar249 = fStack_1a0 * fVar292 + fStack_280 * fVar125;
    fVar260 = fStack_19c * fVar293 + fStack_27c * fVar152;
    fVar184 = (local_138 * fVar261 + local_178 * fVar120) * fVar261 + fVar120 * fVar153;
    fVar185 = (fStack_134 * fVar281 + fStack_174 * fVar122) * fVar281 + fVar122 * fVar305;
    fVar186 = (fStack_130 * fVar292 + fStack_170 * fVar125) * fVar292 + fVar125 * fVar307;
    fVar203 = (fStack_12c * fVar293 + fStack_16c * fVar152) * fVar293 + fVar152 * fVar309;
    fVar204 = (local_148 * fVar261 + local_188 * fVar120) * fVar261 + fVar120 * fVar312;
    fVar205 = (fStack_144 * fVar281 + fStack_184 * fVar122) * fVar281 + fVar122 * fVar315;
    fVar227 = (fStack_140 * fVar292 + fStack_180 * fVar125) * fVar292 + fVar125 * fVar316;
    fVar228 = (fStack_13c * fVar293 + fStack_17c * fVar152) * fVar293 + fVar152 * fVar317;
    fVar229 = (local_158 * fVar261 + local_198 * fVar120) * fVar261 + fVar120 * fVar80;
    fVar232 = (fStack_154 * fVar281 + fStack_194 * fVar122) * fVar281 + fVar122 * fVar154;
    fVar233 = (fStack_150 * fVar292 + fStack_190 * fVar125) * fVar292 + fVar125 * fVar167;
    fVar234 = (fStack_14c * fVar293 + fStack_18c * fVar152) * fVar293 + fVar152 * fVar169;
    fVar247 = (local_168 * fVar261 + local_1a8 * fVar120) * fVar261 + fVar120 * fVar273;
    fVar248 = (fStack_164 * fVar281 + fStack_1a4 * fVar122) * fVar281 + fVar122 * fVar311;
    fVar262 = (fStack_160 * fVar292 + fStack_1a0 * fVar125) * fVar292 + fVar125 * fVar249;
    fVar272 = (fStack_15c * fVar293 + fStack_19c * fVar152) * fVar293 + fVar152 * fVar260;
    fVar295 = fVar153 * fVar261 + (local_1b8 * fVar261 + local_1d8 * fVar120) * fVar120;
    fVar305 = fVar305 * fVar281 + (fStack_1b4 * fVar281 + fStack_1d4 * fVar122) * fVar122;
    fVar307 = fVar307 * fVar292 + (fStack_1b0 * fVar292 + fStack_1d0 * fVar125) * fVar125;
    fVar309 = fVar309 * fVar293 + (fStack_1ac * fVar293 + fStack_1cc * fVar152) * fVar152;
    fVar312 = fVar312 * fVar261 + (local_1c8 * fVar261 + local_1e8 * fVar120) * fVar120;
    fVar315 = fVar315 * fVar281 + (fStack_1c4 * fVar281 + fStack_1e4 * fVar122) * fVar122;
    fVar316 = fVar316 * fVar292 + (fStack_1c0 * fVar292 + fStack_1e0 * fVar125) * fVar125;
    fVar317 = fVar317 * fVar293 + (fStack_1bc * fVar293 + fStack_1dc * fVar152) * fVar152;
    fVar153 = fVar80 * fVar261 + (local_278 * fVar261 + local_1f8 * fVar120) * fVar120;
    fVar154 = fVar154 * fVar281 + (fStack_274 * fVar281 + fStack_1f4 * fVar122) * fVar122;
    fVar167 = fVar167 * fVar292 + (fStack_270 * fVar292 + fStack_1f0 * fVar125) * fVar125;
    fVar169 = fVar169 * fVar293 + (fStack_26c * fVar293 + fStack_1ec * fVar152) * fVar152;
    fVar273 = fVar273 * fVar261 + (local_288 * fVar261 + local_208 * fVar120) * fVar120;
    fVar311 = fVar311 * fVar281 + (fStack_284 * fVar281 + fStack_204 * fVar122) * fVar122;
    fVar249 = fVar249 * fVar292 + (fStack_280 * fVar292 + fStack_200 * fVar125) * fVar125;
    fVar260 = fVar260 * fVar293 + (fStack_27c * fVar293 + fStack_1fc * fVar152) * fVar152;
    local_568._0_4_ = fVar261 * fVar184 + fVar120 * fVar295;
    local_568._4_4_ = fVar281 * fVar185 + fVar122 * fVar305;
    fStack_560 = fVar292 * fVar186 + fVar125 * fVar307;
    fStack_55c = fVar293 * fVar203 + fVar152 * fVar309;
    fVar318 = fVar261 * fVar204 + fVar120 * fVar312;
    fVar321 = fVar281 * fVar205 + fVar122 * fVar315;
    fVar322 = fVar292 * fVar227 + fVar125 * fVar316;
    fVar323 = fVar293 * fVar228 + fVar152 * fVar317;
    fVar296 = fVar261 * fVar229 + fVar120 * fVar153;
    fVar306 = fVar281 * fVar232 + fVar122 * fVar154;
    fVar308 = fVar292 * fVar233 + fVar125 * fVar167;
    fVar310 = fVar293 * fVar234 + fVar152 * fVar169;
    fVar80 = local_388 * 0.11111111;
    fVar261 = fVar261 * fVar247 + fVar120 * fVar273;
    fVar281 = fVar281 * fVar248 + fVar122 * fVar311;
    auVar268._0_8_ = CONCAT44(fVar281,fVar261);
    auVar268._8_4_ = fVar292 * fVar262 + fVar125 * fVar249;
    auVar268._12_4_ = fVar293 * fVar272 + fVar152 * fVar260;
    local_518._0_4_ = (fVar295 - fVar184) * 3.0 * fVar80;
    local_528 = (fVar305 - fVar185) * 3.0 * fVar80;
    fStack_524 = (fVar307 - fVar186) * 3.0 * fVar80;
    fStack_520 = (fVar309 - fVar203) * 3.0 * fVar80;
    local_578 = (fVar312 - fVar204) * 3.0 * fVar80;
    local_538 = (fVar315 - fVar205) * 3.0 * fVar80;
    fStack_534 = (fVar316 - fVar227) * 3.0 * fVar80;
    fStack_530 = (fVar317 - fVar228) * 3.0 * fVar80;
    local_4a8 = (fVar153 - fVar229) * 3.0 * fVar80;
    local_548 = (fVar154 - fVar232) * 3.0 * fVar80;
    fStack_544 = (fVar167 - fVar233) * 3.0 * fVar80;
    fStack_540 = (fVar169 - fVar234) * 3.0 * fVar80;
    fVar120 = fVar80 * (fVar311 - fVar248) * 3.0;
    fVar122 = fVar80 * (fVar249 - fVar262) * 3.0;
    fVar125 = fVar80 * (fVar260 - fVar272) * 3.0;
    local_588._4_4_ = fStack_560;
    local_588._0_4_ = local_568._4_4_;
    fStack_580 = fStack_55c;
    fStack_57c = 0.0;
    local_5a8._4_4_ = fVar308;
    local_5a8._0_4_ = fVar306;
    local_5a8._8_4_ = fVar310;
    local_5a8._12_4_ = 0;
    auVar188._4_4_ = auVar268._8_4_;
    auVar188._0_4_ = fVar281;
    auVar188._8_4_ = auVar268._12_4_;
    auVar188._12_4_ = 0;
    local_5e8._4_4_ = fVar281 + fVar120;
    local_5e8._0_4_ = fVar261 + fVar80 * (fVar273 - fVar247) * 3.0;
    fStack_5e0 = auVar268._8_4_ + fVar122;
    fStack_5dc = auVar268._12_4_ + fVar125;
    auVar137._0_8_ = CONCAT44(auVar268._8_4_ - fVar122,fVar281 - fVar120);
    auVar137._8_4_ = auVar268._12_4_ - fVar125;
    auVar137._12_4_ = 0;
    local_358._4_4_ = fVar322;
    local_358._0_4_ = fVar321;
    fStack_350 = fVar323;
    fStack_34c = 0.0;
    local_3d8 = fVar321 - fVar318;
    fStack_3d4 = fVar322 - fVar321;
    fStack_3d0 = fVar323 - fVar322;
    fStack_3cc = 0.0 - fVar323;
    local_408._0_4_ = fVar306 - fVar296;
    local_408._4_4_ = fVar308 - fVar306;
    fStack_400 = fVar310 - fVar308;
    fStack_3fc = 0.0 - fVar310;
    fVar80 = local_578 * (float)local_408._0_4_ - local_4a8 * local_3d8;
    fVar120 = local_538 * (float)local_408._4_4_ - local_548 * fStack_3d4;
    fVar122 = fStack_534 * fStack_400 - fStack_544 * fStack_3d0;
    fVar125 = fStack_530 * fStack_3fc - fStack_540 * fStack_3cc;
    local_418._0_4_ = (float)local_568._4_4_ - (float)local_568._0_4_;
    local_418._4_4_ = fStack_560 - (float)local_568._4_4_;
    fStack_410 = fStack_55c - fStack_560;
    fStack_40c = 0.0 - fStack_55c;
    fVar152 = local_4a8 * (float)local_418._0_4_ - (float)local_518._0_4_ * (float)local_408._0_4_;
    fVar154 = local_548 * (float)local_418._4_4_ - local_528 * (float)local_408._4_4_;
    fVar169 = fStack_544 * fStack_410 - fStack_524 * fStack_400;
    fVar185 = fStack_540 * fStack_40c - fStack_520 * fStack_3fc;
    fVar153 = (float)local_518._0_4_ * local_3d8 - local_578 * (float)local_418._0_4_;
    fVar167 = local_528 * fStack_3d4 - local_538 * (float)local_418._4_4_;
    fVar184 = fStack_524 * fStack_3d0 - fStack_534 * fStack_410;
    fVar186 = fStack_520 * fStack_3cc - fStack_530 * fStack_40c;
    auVar240._0_4_ = fVar153 * fVar153;
    auVar240._4_4_ = fVar167 * fVar167;
    auVar240._8_4_ = fVar184 * fVar184;
    auVar240._12_4_ = fVar186 * fVar186;
    auVar176._0_4_ =
         (float)local_418._0_4_ * (float)local_418._0_4_ +
         local_3d8 * local_3d8 + (float)local_408._0_4_ * (float)local_408._0_4_;
    auVar176._4_4_ =
         (float)local_418._4_4_ * (float)local_418._4_4_ +
         fStack_3d4 * fStack_3d4 + (float)local_408._4_4_ * (float)local_408._4_4_;
    auVar176._8_4_ = fStack_410 * fStack_410 + fStack_3d0 * fStack_3d0 + fStack_400 * fStack_400;
    auVar176._12_4_ = fStack_40c * fStack_40c + fStack_3cc * fStack_3cc + fStack_3fc * fStack_3fc;
    auVar82 = rcpps(auVar240,auVar176);
    fVar153 = auVar82._0_4_;
    fVar167 = auVar82._4_4_;
    fVar184 = auVar82._8_4_;
    fVar186 = auVar82._12_4_;
    fVar153 = (1.0 - fVar153 * auVar176._0_4_) * fVar153 + fVar153;
    fVar167 = (1.0 - fVar167 * auVar176._4_4_) * fVar167 + fVar167;
    fVar184 = (1.0 - fVar184 * auVar176._8_4_) * fVar184 + fVar184;
    fVar186 = (1.0 - fVar186 * auVar176._12_4_) * fVar186 + fVar186;
    fVar203 = (float)local_408._0_4_ * local_538 - local_3d8 * local_548;
    fVar204 = (float)local_408._4_4_ * fStack_534 - fStack_3d4 * fStack_544;
    fVar205 = fStack_400 * fStack_530 - fStack_3d0 * fStack_540;
    fVar227 = fStack_3fc * 0.0 - fStack_3cc * 0.0;
    local_518._4_4_ = local_528;
    fStack_510 = fStack_524;
    fStack_50c = fStack_520;
    fStack_53c = 0.0;
    fVar228 = (float)local_418._0_4_ * local_548 - (float)local_408._0_4_ * local_528;
    fVar229 = (float)local_418._4_4_ * fStack_544 - (float)local_408._4_4_ * fStack_524;
    fVar232 = fStack_410 * fStack_540 - fStack_400 * fStack_520;
    fVar233 = fStack_40c * 0.0 - fStack_3fc * 0.0;
    fStack_52c = 0.0;
    fStack_51c = 0.0;
    fVar234 = local_3d8 * local_528 - (float)local_418._0_4_ * local_538;
    fVar247 = fStack_3d4 * fStack_524 - (float)local_418._4_4_ * fStack_534;
    fVar248 = fStack_3d0 * fStack_520 - fStack_410 * fStack_530;
    fVar262 = fStack_3cc * 0.0 - fStack_40c * 0.0;
    auVar313._0_4_ = fVar234 * fVar234;
    auVar313._4_4_ = fVar247 * fVar247;
    auVar313._8_4_ = fVar248 * fVar248;
    auVar313._12_4_ = fVar262 * fVar262;
    auVar103._0_4_ = (fVar80 * fVar80 + fVar152 * fVar152 + auVar240._0_4_) * fVar153;
    auVar103._4_4_ = (fVar120 * fVar120 + fVar154 * fVar154 + auVar240._4_4_) * fVar167;
    auVar103._8_4_ = (fVar122 * fVar122 + fVar169 * fVar169 + auVar240._8_4_) * fVar184;
    auVar103._12_4_ = (fVar125 * fVar125 + fVar185 * fVar185 + auVar240._12_4_) * fVar186;
    auVar250._0_4_ = (fVar203 * fVar203 + fVar228 * fVar228 + auVar313._0_4_) * fVar153;
    auVar250._4_4_ = (fVar204 * fVar204 + fVar229 * fVar229 + auVar313._4_4_) * fVar167;
    auVar250._8_4_ = (fVar205 * fVar205 + fVar232 * fVar232 + auVar313._8_4_) * fVar184;
    auVar250._12_4_ = (fVar227 * fVar227 + fVar233 * fVar233 + auVar313._12_4_) * fVar186;
    auVar82 = maxps(auVar103,auVar250);
    auVar241._8_4_ = auVar268._8_4_;
    auVar241._0_8_ = auVar268._0_8_;
    auVar241._12_4_ = auVar268._12_4_;
    auVar267 = maxps(auVar241,_local_5e8);
    auVar222._8_4_ = auVar137._8_4_;
    auVar222._0_8_ = auVar137._0_8_;
    auVar222._12_4_ = 0;
    auVar156 = maxps(auVar222,auVar188);
    auVar267 = maxps(auVar267,auVar156);
    auVar269 = minps(auVar268,_local_5e8);
    auVar156 = minps(auVar137,auVar188);
    auVar156 = minps(auVar269,auVar156);
    auVar82 = sqrtps(auVar82,auVar82);
    auVar269 = rsqrtps(auVar313,auVar176);
    fVar80 = auVar269._0_4_;
    fVar120 = auVar269._4_4_;
    fVar122 = auVar269._8_4_;
    fVar125 = auVar269._12_4_;
    fVar272 = fVar80 * fVar80 * auVar176._0_4_ * -0.5 * fVar80 + fVar80 * 1.5;
    fVar273 = fVar120 * fVar120 * auVar176._4_4_ * -0.5 * fVar120 + fVar120 * 1.5;
    fVar311 = fVar122 * fVar122 * auVar176._8_4_ * -0.5 * fVar122 + fVar122 * 1.5;
    fVar249 = fVar125 * fVar125 * auVar176._12_4_ * -0.5 * fVar125 + fVar125 * 1.5;
    local_368 = 0.0 - fVar318;
    fStack_364 = 0.0 - fVar321;
    fStack_360 = 0.0 - fVar322;
    fStack_35c = 0.0 - fVar323;
    local_378 = 0.0 - fVar296;
    fStack_374 = 0.0 - fVar306;
    fStack_370 = 0.0 - fVar308;
    fStack_36c = 0.0 - fVar310;
    fVar203 = 0.0 - (float)local_568._0_4_;
    fVar205 = 0.0 - (float)local_568._4_4_;
    fVar228 = 0.0 - fStack_560;
    fVar232 = 0.0 - fStack_55c;
    auVar223._0_4_ = local_3e8 * local_3d8 * fVar272 + local_338 * (float)local_408._0_4_ * fVar272;
    auVar223._4_4_ =
         fStack_3e4 * fStack_3d4 * fVar273 + fStack_334 * (float)local_408._4_4_ * fVar273;
    auVar223._8_4_ = fStack_3e0 * fStack_3d0 * fVar311 + fStack_330 * fStack_400 * fVar311;
    auVar223._12_4_ = fStack_3dc * fStack_3cc * fVar249 + fStack_32c * fStack_3fc * fVar249;
    auVar189._8_4_ = fVar311;
    auVar189._0_8_ = CONCAT44(fVar273,fVar272);
    auVar189._12_4_ = fVar249;
    local_2f8._0_4_ = local_2e8 * (float)local_418._0_4_ * fVar272 + auVar223._0_4_;
    local_2f8._4_4_ = fStack_2e4 * (float)local_418._4_4_ * fVar273 + auVar223._4_4_;
    fStack_2f0 = fStack_2e0 * fStack_410 * fVar311 + auVar223._8_4_;
    fStack_2ec = fStack_2dc * fStack_40c * fVar249 + auVar223._12_4_;
    local_308._0_4_ =
         (float)local_418._0_4_ * fVar272 * fVar203 +
         local_3d8 * fVar272 * local_368 + (float)local_408._0_4_ * fVar272 * local_378;
    local_308._4_4_ =
         (float)local_418._4_4_ * fVar273 * fVar205 +
         fStack_3d4 * fVar273 * fStack_364 + (float)local_408._4_4_ * fVar273 * fStack_374;
    fStack_300 = fStack_410 * fVar311 * fVar228 +
                 fStack_3d0 * fVar311 * fStack_360 + fStack_400 * fVar311 * fStack_370;
    fStack_2fc = fStack_40c * fVar249 * fVar232 +
                 fStack_3cc * fVar249 * fStack_35c + fStack_3fc * fVar249 * fStack_36c;
    fVar169 = (local_2e8 * fVar203 + local_3e8 * local_368 + local_338 * local_378) -
              (float)local_2f8._0_4_ * (float)local_308._0_4_;
    fVar184 = (fStack_2e4 * fVar205 + fStack_3e4 * fStack_364 + fStack_334 * fStack_374) -
              (float)local_2f8._4_4_ * (float)local_308._4_4_;
    fVar185 = (fStack_2e0 * fVar228 + fStack_3e0 * fStack_360 + fStack_330 * fStack_370) -
              fStack_2f0 * fStack_300;
    fVar186 = (fStack_2dc * fVar232 + fStack_3dc * fStack_35c + fStack_32c * fStack_36c) -
              fStack_2ec * fStack_2fc;
    fVar234 = (fVar203 * fVar203 + local_368 * local_368 + local_378 * local_378) -
              (float)local_308._0_4_ * (float)local_308._0_4_;
    fVar247 = (fVar205 * fVar205 + fStack_364 * fStack_364 + fStack_374 * fStack_374) -
              (float)local_308._4_4_ * (float)local_308._4_4_;
    fVar248 = (fVar228 * fVar228 + fStack_360 * fStack_360 + fStack_370 * fStack_370) -
              fStack_300 * fStack_300;
    fVar262 = (fVar232 * fVar232 + fStack_35c * fStack_35c + fStack_36c * fStack_36c) -
              fStack_2fc * fStack_2fc;
    fVar80 = (auVar267._0_4_ + auVar82._0_4_) * 1.0000002;
    fVar120 = (auVar267._4_4_ + auVar82._4_4_) * 1.0000002;
    fVar122 = (auVar267._8_4_ + auVar82._8_4_) * 1.0000002;
    fVar125 = (auVar267._12_4_ + auVar82._12_4_) * 1.0000002;
    fVar204 = fVar234 - fVar80 * fVar80;
    fVar227 = fVar247 - fVar120 * fVar120;
    fVar229 = fVar248 - fVar122 * fVar122;
    fVar233 = fVar262 - fVar125 * fVar125;
    fVar152 = (float)local_2f8._0_4_ * (float)local_2f8._0_4_;
    fVar153 = (float)local_2f8._4_4_ * (float)local_2f8._4_4_;
    fVar154 = fStack_2f0 * fStack_2f0;
    fVar167 = fStack_2ec * fStack_2ec;
    fVar260 = local_128 - fVar152;
    fVar261 = fStack_124 - fVar153;
    fVar281 = fStack_120 - fVar154;
    fVar292 = fStack_11c - fVar167;
    local_488._0_4_ = fVar169 + fVar169;
    local_488._4_4_ = fVar184 + fVar184;
    fStack_480 = fVar185 + fVar185;
    fStack_47c = fVar186 + fVar186;
    local_3a8._0_4_ = (float)local_488._0_4_ * (float)local_488._0_4_;
    local_3a8._4_4_ = (float)local_488._4_4_ * (float)local_488._4_4_;
    fStack_3a0 = fStack_480 * fStack_480;
    fStack_39c = fStack_47c * fStack_47c;
    fVar80 = fVar260 * 4.0;
    fVar120 = fVar261 * 4.0;
    fVar122 = fVar281 * 4.0;
    fVar125 = fVar292 * 4.0;
    auVar242._0_4_ = (float)local_3a8._0_4_ - fVar80 * fVar204;
    auVar242._4_4_ = (float)local_3a8._4_4_ - fVar120 * fVar227;
    auVar242._8_4_ = fStack_3a0 - fVar122 * fVar229;
    auVar242._12_4_ = fStack_39c - fVar125 * fVar233;
    local_5e8._4_4_ = (auVar156._4_4_ - auVar82._4_4_) * 0.99999976;
    local_5e8._0_4_ = (auVar156._0_4_ - auVar82._0_4_) * 0.99999976;
    fStack_5e0 = (auVar156._8_4_ - auVar82._8_4_) * 0.99999976;
    fStack_5dc = (auVar156._12_4_ - auVar82._12_4_) * 0.99999976;
    auVar289._4_4_ = -(uint)(0.0 <= auVar242._4_4_);
    auVar289._0_4_ = -(uint)(0.0 <= auVar242._0_4_);
    auVar289._8_4_ = -(uint)(0.0 <= auVar242._8_4_);
    auVar289._12_4_ = -(uint)(0.0 <= auVar242._12_4_);
    uVar67 = 0;
    iVar61 = movmskps((int)uVar64,auVar289);
    if (iVar61 == 0) {
      iVar61 = 0;
      auVar139 = _DAT_01feb9f0;
      auVar225 = _DAT_01feba00;
    }
    else {
      auVar156 = sqrtps(_local_488,auVar242);
      bVar23 = 0.0 <= auVar242._0_4_;
      uVar75 = -(uint)bVar23;
      bVar74 = 0.0 <= auVar242._4_4_;
      uVar76 = -(uint)bVar74;
      bVar24 = 0.0 <= auVar242._8_4_;
      uVar77 = -(uint)bVar24;
      bVar25 = 0.0 <= auVar242._12_4_;
      uVar78 = -(uint)bVar25;
      auVar138._0_4_ = fVar260 + fVar260;
      auVar138._4_4_ = fVar261 + fVar261;
      auVar138._8_4_ = fVar281 + fVar281;
      auVar138._12_4_ = fVar292 + fVar292;
      auVar82 = rcpps(auVar223,auVar138);
      fVar169 = auVar82._0_4_;
      fVar185 = auVar82._4_4_;
      fVar293 = auVar82._8_4_;
      fVar305 = auVar82._12_4_;
      fVar169 = (1.0 - auVar138._0_4_ * fVar169) * fVar169 + fVar169;
      fVar185 = (1.0 - auVar138._4_4_ * fVar185) * fVar185 + fVar185;
      fVar293 = (1.0 - auVar138._8_4_ * fVar293) * fVar293 + fVar293;
      fVar305 = (1.0 - auVar138._12_4_ * fVar305) * fVar305 + fVar305;
      fVar184 = (-(float)local_488._0_4_ - auVar156._0_4_) * fVar169;
      fVar186 = (-(float)local_488._4_4_ - auVar156._4_4_) * fVar185;
      fVar295 = (-fStack_480 - auVar156._8_4_) * fVar293;
      fVar307 = (-fStack_47c - auVar156._12_4_) * fVar305;
      fVar169 = (auVar156._0_4_ - (float)local_488._0_4_) * fVar169;
      fVar185 = (auVar156._4_4_ - (float)local_488._4_4_) * fVar185;
      fVar293 = (auVar156._8_4_ - fStack_480) * fVar293;
      fVar305 = (auVar156._12_4_ - fStack_47c) * fVar305;
      local_2b8[0] = ((float)local_2f8._0_4_ * fVar184 + (float)local_308._0_4_) * fVar272;
      local_2b8[1] = ((float)local_2f8._4_4_ * fVar186 + (float)local_308._4_4_) * fVar273;
      local_2b8[2] = (fStack_2f0 * fVar295 + fStack_300) * fVar311;
      local_2b8[3] = (fStack_2ec * fVar307 + fStack_2fc) * fVar249;
      local_2c8[0] = ((float)local_2f8._0_4_ * fVar169 + (float)local_308._0_4_) * fVar272;
      local_2c8[1] = ((float)local_2f8._4_4_ * fVar185 + (float)local_308._4_4_) * fVar273;
      local_2c8[2] = (fStack_2f0 * fVar293 + fStack_300) * fVar311;
      local_2c8[3] = (fStack_2ec * fVar305 + fStack_2fc) * fVar249;
      auVar224._0_4_ = (uint)fVar184 & uVar75;
      auVar224._4_4_ = (uint)fVar186 & uVar76;
      auVar224._8_4_ = (uint)fVar295 & uVar77;
      auVar224._12_4_ = (uint)fVar307 & uVar78;
      auVar139._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x7f8000007f800000;
      auVar139._8_4_ = ~uVar77 & 0x7f800000;
      auVar139._12_4_ = ~uVar78 & 0x7f800000;
      auVar139 = auVar139 | auVar224;
      auVar251._0_4_ = (uint)fVar169 & uVar75;
      auVar251._4_4_ = (uint)fVar185 & uVar76;
      auVar251._8_4_ = (uint)fVar293 & uVar77;
      auVar251._12_4_ = (uint)fVar305 & uVar78;
      auVar225._0_8_ = CONCAT44(~uVar76,~uVar75) & 0xff800000ff800000;
      auVar225._8_4_ = ~uVar77 & 0xff800000;
      auVar225._12_4_ = ~uVar78 & 0xff800000;
      auVar225 = auVar225 | auVar251;
      auVar252._0_8_ = CONCAT44(fVar153,fVar152) & 0x7fffffff7fffffff;
      auVar252._8_4_ = ABS(fVar154);
      auVar252._12_4_ = ABS(fVar167);
      auVar37._4_4_ = fStack_294;
      auVar37._0_4_ = local_298;
      auVar37._8_4_ = fStack_290;
      auVar37._12_4_ = fStack_28c;
      auVar82 = maxps(auVar37,auVar252);
      fVar169 = auVar82._0_4_ * 1.9073486e-06;
      fVar184 = auVar82._4_4_ * 1.9073486e-06;
      fVar185 = auVar82._8_4_ * 1.9073486e-06;
      fVar186 = auVar82._12_4_ * 1.9073486e-06;
      auVar253._0_4_ = -(uint)(ABS(fVar260) < fVar169 && bVar23);
      auVar253._4_4_ = -(uint)(ABS(fVar261) < fVar184 && bVar74);
      auVar253._8_4_ = -(uint)(ABS(fVar281) < fVar185 && bVar24);
      auVar253._12_4_ = -(uint)(ABS(fVar292) < fVar186 && bVar25);
      iVar61 = movmskps(iVar61,auVar253);
      if (iVar61 != 0) {
        uVar75 = -(uint)(fVar204 <= 0.0);
        uVar76 = -(uint)(fVar227 <= 0.0);
        uVar77 = -(uint)(fVar229 <= 0.0);
        uVar78 = -(uint)(fVar233 <= 0.0);
        auVar314._0_4_ = (uVar75 & 0xff800000 | ~uVar75 & 0x7f800000) & auVar253._0_4_;
        auVar314._4_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar253._4_4_;
        auVar314._8_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar253._8_4_;
        auVar314._12_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar253._12_4_;
        auVar200._0_4_ = ~auVar253._0_4_ & auVar139._0_4_;
        auVar200._4_4_ = ~auVar253._4_4_ & auVar139._4_4_;
        auVar200._8_4_ = ~auVar253._8_4_ & auVar139._8_4_;
        auVar200._12_4_ = ~auVar253._12_4_ & auVar139._12_4_;
        auVar139 = auVar200 | auVar314;
        auVar201._0_4_ = (uVar75 & 0x7f800000 | ~uVar75 & 0xff800000) & auVar253._0_4_;
        auVar201._4_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar253._4_4_;
        auVar201._8_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar253._8_4_;
        auVar201._12_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar253._12_4_;
        auVar259._0_4_ = ~auVar253._0_4_ & auVar225._0_4_;
        auVar259._4_4_ = ~auVar253._4_4_ & auVar225._4_4_;
        auVar259._8_4_ = ~auVar253._8_4_ & auVar225._8_4_;
        auVar259._12_4_ = ~auVar253._12_4_ & auVar225._12_4_;
        auVar225 = auVar259 | auVar201;
        auVar289._4_4_ = -(uint)((fVar184 <= ABS(fVar261) || fVar227 <= 0.0) && bVar74);
        auVar289._0_4_ = -(uint)((fVar169 <= ABS(fVar260) || fVar204 <= 0.0) && bVar23);
        auVar289._8_4_ = -(uint)((fVar185 <= ABS(fVar281) || fVar229 <= 0.0) && bVar24);
        auVar289._12_4_ = -(uint)((fVar186 <= ABS(fVar292) || fVar233 <= 0.0) && bVar25);
      }
    }
    auVar290._0_4_ = (auVar289._0_4_ << 0x1f) >> 0x1f;
    auVar290._4_4_ = (auVar289._4_4_ << 0x1f) >> 0x1f;
    auVar290._8_4_ = (auVar289._8_4_ << 0x1f) >> 0x1f;
    auVar290._12_4_ = (auVar289._12_4_ << 0x1f) >> 0x1f;
    auVar290 = auVar290 & local_218;
    iVar61 = movmskps(iVar61,auVar290);
    uVar64 = uVar69;
    fStack_574 = local_538;
    fStack_570 = fStack_534;
    fStack_56c = fStack_530;
    fStack_4a4 = local_548;
    fStack_4a0 = fStack_544;
    fStack_49c = fStack_540;
    if (iVar61 != 0) {
      local_428._4_4_ = fVar120;
      local_428._0_4_ = fVar80;
      fStack_420 = fVar122;
      fStack_41c = fVar125;
      local_238 = fVar152;
      fStack_234 = fVar153;
      fStack_230 = fVar154;
      fStack_22c = fVar167;
      local_348 = fVar260;
      fStack_344 = fVar261;
      fStack_340 = fVar281;
      fStack_33c = fVar292;
      _local_228 = auVar189;
      local_4b8._4_4_ = fVar247;
      local_4b8._0_4_ = fVar234;
      fStack_4b0 = fVar248;
      fStack_4ac = fVar262;
      auVar243._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2d8._0_4_;
      auVar243._4_4_ = auVar243._0_4_;
      auVar243._8_4_ = auVar243._0_4_;
      auVar243._12_4_ = auVar243._0_4_;
      auVar267 = maxps(auVar243,auVar139);
      auVar190._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2d8._0_4_;
      auVar190._4_4_ = auVar190._0_4_;
      auVar190._8_4_ = auVar190._0_4_;
      auVar190._12_4_ = auVar190._0_4_;
      auVar156 = minps(auVar190,auVar225);
      auVar104._0_4_ = local_368 * local_578 + local_378 * local_4a8;
      auVar104._4_4_ = fStack_364 * local_538 + fStack_374 * local_548;
      auVar104._8_4_ = fStack_360 * fStack_534 + fStack_370 * fStack_544;
      auVar104._12_4_ = fStack_35c * fStack_530 + fStack_36c * fStack_540;
      auVar140._0_4_ =
           (float)local_518._0_4_ * local_2e8 + local_578 * local_3e8 + local_4a8 * local_338;
      auVar140._4_4_ = local_528 * fStack_2e4 + local_538 * fStack_3e4 + local_548 * fStack_334;
      auVar140._8_4_ = fStack_524 * fStack_2e0 + fStack_534 * fStack_3e0 + fStack_544 * fStack_330;
      auVar140._12_4_ = fStack_520 * fStack_2dc + fStack_530 * fStack_3dc + fStack_540 * fStack_32c;
      auVar82 = rcpps(auVar104,auVar140);
      fVar169 = auVar82._0_4_;
      fVar184 = auVar82._4_4_;
      fVar185 = auVar82._8_4_;
      fVar186 = auVar82._12_4_;
      fVar169 = ((1.0 - auVar140._0_4_ * fVar169) * fVar169 + fVar169) *
                -(fVar203 * (float)local_518._0_4_ + auVar104._0_4_);
      fVar184 = ((1.0 - auVar140._4_4_ * fVar184) * fVar184 + fVar184) *
                -(fVar205 * local_528 + auVar104._4_4_);
      fVar185 = ((1.0 - auVar140._8_4_ * fVar185) * fVar185 + fVar185) *
                -(fVar228 * fStack_524 + auVar104._8_4_);
      fVar186 = ((1.0 - auVar140._12_4_ * fVar186) * fVar186 + fVar186) *
                -(fVar232 * fStack_520 + auVar104._12_4_);
      auVar231._0_12_ = ZEXT812(0);
      auVar231._12_4_ = 0.0;
      uVar75 = -(uint)(auVar140._0_4_ < 0.0 || ABS(auVar140._0_4_) < 1e-18);
      uVar76 = -(uint)(auVar140._4_4_ < 0.0 || ABS(auVar140._4_4_) < 1e-18);
      uVar77 = -(uint)(auVar140._8_4_ < 0.0 || ABS(auVar140._8_4_) < 1e-18);
      uVar78 = -(uint)(auVar140._12_4_ < 0.0 || ABS(auVar140._12_4_) < 1e-18);
      auVar226._0_8_ = CONCAT44(uVar76,uVar75) & 0xff800000ff800000;
      auVar226._8_4_ = uVar77 & 0xff800000;
      auVar226._12_4_ = uVar78 & 0xff800000;
      auVar105._0_4_ = ~uVar75 & (uint)fVar169;
      auVar105._4_4_ = ~uVar76 & (uint)fVar184;
      auVar105._8_4_ = ~uVar77 & (uint)fVar185;
      auVar105._12_4_ = ~uVar78 & (uint)fVar186;
      auVar267 = maxps(auVar267,auVar105 | auVar226);
      uVar75 = -(uint)(0.0 < auVar140._0_4_ || ABS(auVar140._0_4_) < 1e-18);
      uVar76 = -(uint)(0.0 < auVar140._4_4_ || ABS(auVar140._4_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar140._8_4_ || ABS(auVar140._8_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar140._12_4_ || ABS(auVar140._12_4_) < 1e-18);
      auVar106._0_8_ = CONCAT44(uVar76,uVar75) & 0x7f8000007f800000;
      auVar106._8_4_ = uVar77 & 0x7f800000;
      auVar106._12_4_ = uVar78 & 0x7f800000;
      auVar141._0_4_ = ~uVar75 & (uint)fVar169;
      auVar141._4_4_ = ~uVar76 & (uint)fVar184;
      auVar141._8_4_ = ~uVar77 & (uint)fVar185;
      auVar141._12_4_ = ~uVar78 & (uint)fVar186;
      auVar156 = minps(auVar156,auVar141 | auVar106);
      auVar142._0_4_ = (0.0 - fVar321) * -local_538 + (0.0 - fVar306) * -local_548;
      auVar142._4_4_ = (0.0 - fVar322) * -fStack_534 + (0.0 - fVar308) * -fStack_544;
      auVar142._8_4_ = (0.0 - fVar323) * -fStack_530 + (0.0 - fVar310) * -fStack_540;
      auVar142._12_4_ = 0x80000000;
      auVar319._0_4_ = -local_528 * local_2e8 + -local_538 * local_3e8 + -local_548 * local_338;
      auVar319._4_4_ =
           -fStack_524 * fStack_2e4 + -fStack_534 * fStack_3e4 + -fStack_544 * fStack_334;
      auVar319._8_4_ =
           -fStack_520 * fStack_2e0 + -fStack_530 * fStack_3e0 + -fStack_540 * fStack_330;
      auVar319._12_4_ = fStack_2dc * -0.0 + fStack_3dc * -0.0 + fStack_32c * -0.0;
      auVar82 = rcpps(auVar142,auVar319);
      fVar169 = auVar82._0_4_;
      fVar184 = auVar82._4_4_;
      fVar185 = auVar82._8_4_;
      fVar186 = auVar82._12_4_;
      fVar169 = ((fVar274 - auVar319._0_4_ * fVar169) * fVar169 + fVar169) *
                -((0.0 - (float)local_568._4_4_) * -local_528 + auVar142._0_4_);
      fVar184 = ((fVar282 - auVar319._4_4_ * fVar184) * fVar184 + fVar184) *
                -((0.0 - fStack_560) * -fStack_524 + auVar142._4_4_);
      fVar185 = ((fVar283 - auVar319._8_4_ * fVar185) * fVar185 + fVar185) *
                -((0.0 - fStack_55c) * -fStack_520 + auVar142._8_4_);
      fVar186 = ((fVar294 - auVar319._12_4_ * fVar186) * fVar186 + fVar186) * 0.0;
      uVar75 = -(uint)(auVar319._0_4_ < 0.0 || ABS(auVar319._0_4_) < 1e-18);
      uVar76 = -(uint)(auVar319._4_4_ < 0.0 || ABS(auVar319._4_4_) < 1e-18);
      uVar77 = -(uint)(auVar319._8_4_ < 0.0 || ABS(auVar319._8_4_) < 1e-18);
      uVar78 = -(uint)(auVar319._12_4_ < 0.0 || ABS(auVar319._12_4_) < 1e-18);
      auVar143._0_8_ = CONCAT44(uVar76,uVar75) & 0xff800000ff800000;
      auVar143._8_4_ = uVar77 & 0xff800000;
      auVar143._12_4_ = uVar78 & 0xff800000;
      auVar107._0_4_ = ~uVar75 & (uint)fVar169;
      auVar107._4_4_ = ~uVar76 & (uint)fVar184;
      auVar107._8_4_ = ~uVar77 & (uint)fVar185;
      auVar107._12_4_ = ~uVar78 & (uint)fVar186;
      local_3c8 = maxps(auVar267,auVar107 | auVar143);
      uVar75 = -(uint)(0.0 < auVar319._0_4_ || ABS(auVar319._0_4_) < 1e-18);
      uVar76 = -(uint)(0.0 < auVar319._4_4_ || ABS(auVar319._4_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar319._8_4_ || ABS(auVar319._8_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar319._12_4_ || ABS(auVar319._12_4_) < 1e-18);
      auVar108._0_8_ = CONCAT44(uVar76,uVar75) & 0x7f8000007f800000;
      auVar108._8_4_ = uVar77 & 0x7f800000;
      auVar108._12_4_ = uVar78 & 0x7f800000;
      auVar320._0_4_ = ~uVar75 & (uint)fVar169;
      auVar320._4_4_ = ~uVar76 & (uint)fVar184;
      auVar320._8_4_ = ~uVar77 & (uint)fVar185;
      auVar320._12_4_ = ~uVar78 & (uint)fVar186;
      _local_518 = minps(auVar156,auVar320 | auVar108);
      fVar169 = local_3c8._12_4_;
      fVar184 = local_3c8._0_4_;
      fVar185 = local_3c8._4_4_;
      fVar186 = local_3c8._8_4_;
      auVar302._0_4_ = -(uint)(fVar184 <= local_518._0_4_) & auVar290._0_4_;
      auVar302._4_4_ = -(uint)(fVar185 <= local_518._4_4_) & auVar290._4_4_;
      auVar302._8_4_ = -(uint)(fVar186 <= local_518._8_4_) & auVar290._8_4_;
      auVar302._12_4_ = -(uint)(fVar169 <= local_518._12_4_) & auVar290._12_4_;
      iVar61 = movmskps(iVar61,auVar302);
      if (iVar61 != 0) {
        auVar82 = maxps(ZEXT816(0),_local_5e8);
        auVar36._4_4_ = local_2b8[1];
        auVar36._0_4_ = local_2b8[0];
        auVar36._8_4_ = local_2b8[2];
        auVar36._12_4_ = local_2b8[3];
        auVar156 = minps(auVar36,_DAT_01feca10);
        auVar156 = maxps(auVar156,auVar231);
        auVar35._4_4_ = local_2c8[1];
        auVar35._0_4_ = local_2c8[0];
        auVar35._8_4_ = local_2c8[2];
        auVar35._12_4_ = local_2c8[3];
        auVar267 = minps(auVar35,_DAT_01feca10);
        auVar267 = maxps(auVar267,auVar231);
        local_2b8[0] = (auVar156._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_388 + fVar168;
        local_2b8[1] = (auVar156._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_388 + fVar168;
        local_2b8[2] = (auVar156._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_388 + fVar168;
        local_2b8[3] = (auVar156._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_388 + fVar168;
        local_2c8[0] = (auVar267._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_388 + fVar168;
        local_2c8[1] = (auVar267._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_388 + fVar168;
        local_2c8[2] = (auVar267._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_388 + fVar168;
        local_2c8[3] = (auVar267._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_388 + fVar168;
        auVar144._0_4_ = fVar234 - auVar82._0_4_ * auVar82._0_4_;
        auVar144._4_4_ = fVar247 - auVar82._4_4_ * auVar82._4_4_;
        auVar144._8_4_ = fVar248 - auVar82._8_4_ * auVar82._8_4_;
        auVar144._12_4_ = fVar262 - auVar82._12_4_ * auVar82._12_4_;
        auVar244._0_4_ = (float)local_3a8._0_4_ - fVar80 * auVar144._0_4_;
        auVar244._4_4_ = (float)local_3a8._4_4_ - fVar120 * auVar144._4_4_;
        auVar244._8_4_ = fStack_3a0 - fVar122 * auVar144._8_4_;
        auVar244._12_4_ = fStack_39c - fVar125 * auVar144._12_4_;
        local_428._4_4_ = -(uint)(0.0 <= auVar244._4_4_);
        local_428._0_4_ = -(uint)(0.0 <= auVar244._0_4_);
        fStack_420 = (float)-(uint)(0.0 <= auVar244._8_4_);
        fStack_41c = (float)-(uint)(0.0 <= auVar244._12_4_);
        iVar61 = movmskps(iVar61,_local_428);
        if (iVar61 == 0) {
          fVar233 = 0.0;
          fVar234 = 0.0;
          fVar247 = 0.0;
          fVar248 = 0.0;
          fVar227 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar232 = 0.0;
          fVar168 = 0.0;
          fVar80 = 0.0;
          fVar120 = 0.0;
          fVar122 = 0.0;
          fVar125 = 0.0;
          fVar203 = 0.0;
          fVar204 = 0.0;
          fVar205 = 0.0;
          _local_488 = ZEXT816(0);
          iVar61 = 0;
          auVar145 = _DAT_01feba00;
          auVar254 = _DAT_01feb9f0;
        }
        else {
          auVar156 = sqrtps(_DAT_01ff1da0,auVar244);
          auVar109._0_4_ = fVar260 + fVar260;
          auVar109._4_4_ = fVar261 + fVar261;
          auVar109._8_4_ = fVar281 + fVar281;
          auVar109._12_4_ = fVar292 + fVar292;
          auVar82 = rcpps(auVar144,auVar109);
          fVar262 = auVar82._0_4_;
          fVar272 = auVar82._4_4_;
          fVar273 = auVar82._8_4_;
          fVar311 = auVar82._12_4_;
          fVar262 = (fVar274 - auVar109._0_4_ * fVar262) * fVar262 + fVar262;
          fVar272 = (fVar282 - auVar109._4_4_ * fVar272) * fVar272 + fVar272;
          fVar273 = (fVar283 - auVar109._8_4_ * fVar273) * fVar273 + fVar273;
          fVar311 = (fVar294 - auVar109._12_4_ * fVar311) * fVar311 + fVar311;
          fVar293 = (-(float)local_488._0_4_ - auVar156._0_4_) * fVar262;
          fVar294 = (-(float)local_488._4_4_ - auVar156._4_4_) * fVar272;
          fVar295 = (-fStack_480 - auVar156._8_4_) * fVar273;
          fVar305 = (-fStack_47c - auVar156._12_4_) * fVar311;
          fVar262 = (auVar156._0_4_ - (float)local_488._0_4_) * fVar262;
          fVar272 = (auVar156._4_4_ - (float)local_488._4_4_) * fVar272;
          fVar273 = (auVar156._8_4_ - fStack_480) * fVar273;
          fVar311 = (auVar156._12_4_ - fStack_47c) * fVar311;
          local_228._0_4_ = auVar189._0_4_;
          local_228._4_4_ = auVar189._4_4_;
          fStack_220 = auVar189._8_4_;
          fStack_21c = auVar189._12_4_;
          fVar227 = ((float)local_2f8._0_4_ * fVar293 + (float)local_308._0_4_) *
                    (float)local_228._0_4_;
          fVar228 = ((float)local_2f8._4_4_ * fVar294 + (float)local_308._4_4_) *
                    (float)local_228._4_4_;
          fVar229 = (fStack_2f0 * fVar295 + fStack_300) * fStack_220;
          fVar232 = (fStack_2ec * fVar305 + fStack_2fc) * fStack_21c;
          fVar168 = local_2e8 * fVar293 -
                    ((float)local_418._0_4_ * fVar227 + (float)local_568._0_4_);
          fVar80 = fStack_2e4 * fVar294 -
                   ((float)local_418._4_4_ * fVar228 + (float)local_568._4_4_);
          fVar120 = fStack_2e0 * fVar295 - (fStack_410 * fVar229 + fStack_560);
          fVar122 = fStack_2dc * fVar305 - (fStack_40c * fVar232 + fStack_55c);
          fVar125 = local_3e8 * fVar293 - (local_3d8 * fVar227 + fVar318);
          fVar203 = fStack_3e4 * fVar294 - (fStack_3d4 * fVar228 + fVar321);
          fVar204 = fStack_3e0 * fVar295 - (fStack_3d0 * fVar229 + fVar322);
          fVar205 = fStack_3dc * fVar305 - (fStack_3cc * fVar232 + fVar323);
          local_488._4_4_ = fStack_334 * fVar294 - (fVar228 * (float)local_408._4_4_ + fVar306);
          local_488._0_4_ = local_338 * fVar293 - (fVar227 * (float)local_408._0_4_ + fVar296);
          fStack_480 = fStack_330 * fVar295 - (fVar229 * fStack_400 + fVar308);
          fStack_47c = fStack_32c * fVar305 - (fVar232 * fStack_3fc + fVar310);
          fVar249 = ((float)local_2f8._0_4_ * fVar262 + (float)local_308._0_4_) *
                    (float)local_228._0_4_;
          fVar274 = ((float)local_2f8._4_4_ * fVar272 + (float)local_308._4_4_) *
                    (float)local_228._4_4_;
          fVar282 = (fStack_2f0 * fVar273 + fStack_300) * fStack_220;
          fVar283 = (fStack_2ec * fVar311 + fStack_2fc) * fStack_21c;
          fVar233 = local_2e8 * fVar262 -
                    ((float)local_418._0_4_ * fVar249 + (float)local_568._0_4_);
          fVar234 = fStack_2e4 * fVar272 -
                    ((float)local_418._4_4_ * fVar274 + (float)local_568._4_4_);
          fVar247 = fStack_2e0 * fVar273 - (fStack_410 * fVar282 + fStack_560);
          fVar248 = fStack_2dc * fVar311 - (fStack_40c * fVar283 + fStack_55c);
          fVar227 = local_3e8 * fVar262 - (local_3d8 * fVar249 + fVar318);
          fVar228 = fStack_3e4 * fVar272 - (fStack_3d4 * fVar274 + fVar321);
          fVar229 = fStack_3e0 * fVar273 - (fStack_3d0 * fVar282 + fVar322);
          fVar232 = fStack_3dc * fVar311 - (fStack_3cc * fVar283 + fVar323);
          bVar23 = 0.0 <= auVar244._0_4_;
          uVar75 = -(uint)bVar23;
          bVar74 = 0.0 <= auVar244._4_4_;
          uVar76 = -(uint)bVar74;
          bVar24 = 0.0 <= auVar244._8_4_;
          uVar77 = -(uint)bVar24;
          bVar25 = 0.0 <= auVar244._12_4_;
          uVar78 = -(uint)bVar25;
          auVar231._0_4_ = local_338 * fVar262 - (fVar249 * (float)local_408._0_4_ + fVar296);
          auVar231._4_4_ = fStack_334 * fVar272 - (fVar274 * (float)local_408._4_4_ + fVar306);
          auVar231._8_4_ = fStack_330 * fVar273 - (fVar282 * fStack_400 + fVar308);
          auVar231._12_4_ = fStack_32c * fVar311 - (fVar283 * fStack_3fc + fVar310);
          auVar270._0_4_ = (uint)fVar293 & uVar75;
          auVar270._4_4_ = (uint)fVar294 & uVar76;
          auVar270._8_4_ = (uint)fVar295 & uVar77;
          auVar270._12_4_ = (uint)fVar305 & uVar78;
          auVar254._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x7f8000007f800000;
          auVar254._8_4_ = ~uVar77 & 0x7f800000;
          auVar254._12_4_ = ~uVar78 & 0x7f800000;
          auVar254 = auVar254 | auVar270;
          auVar191._0_4_ = (uint)fVar262 & uVar75;
          auVar191._4_4_ = (uint)fVar272 & uVar76;
          auVar191._8_4_ = (uint)fVar273 & uVar77;
          auVar191._12_4_ = (uint)fVar311 & uVar78;
          auVar145._0_8_ = CONCAT44(~uVar76,~uVar75) & 0xff800000ff800000;
          auVar145._8_4_ = ~uVar77 & 0xff800000;
          auVar145._12_4_ = ~uVar78 & 0xff800000;
          auVar145 = auVar145 | auVar191;
          auVar110._0_8_ = CONCAT44(fVar153,fVar152) & 0x7fffffff7fffffff;
          auVar110._8_4_ = ABS(fVar154);
          auVar110._12_4_ = ABS(fVar167);
          auVar38._4_4_ = fStack_294;
          auVar38._0_4_ = local_298;
          auVar38._8_4_ = fStack_290;
          auVar38._12_4_ = fStack_28c;
          auVar82 = maxps(auVar38,auVar110);
          fVar152 = auVar82._0_4_ * 1.9073486e-06;
          fVar153 = auVar82._4_4_ * 1.9073486e-06;
          fVar154 = auVar82._8_4_ * 1.9073486e-06;
          fVar167 = auVar82._12_4_ * 1.9073486e-06;
          auVar192._0_4_ = -(uint)(ABS(fVar260) < fVar152 && bVar23);
          auVar192._4_4_ = -(uint)(ABS(fVar261) < fVar153 && bVar74);
          auVar192._8_4_ = -(uint)(ABS(fVar281) < fVar154 && bVar24);
          auVar192._12_4_ = -(uint)(ABS(fVar292) < fVar167 && bVar25);
          iVar61 = movmskps(iVar61,auVar192);
          _local_588 = auVar302;
          local_578 = fVar125;
          fStack_574 = fVar203;
          fStack_570 = fVar204;
          fStack_56c = fVar205;
          _local_4b8 = auVar144;
          if (iVar61 != 0) {
            uVar75 = -(uint)(auVar144._0_4_ <= 0.0);
            uVar76 = -(uint)(auVar144._4_4_ <= 0.0);
            uVar77 = -(uint)(auVar144._8_4_ <= 0.0);
            uVar78 = -(uint)(auVar144._12_4_ <= 0.0);
            auVar279._0_4_ = (uVar75 & 0xff800000 | ~uVar75 & 0x7f800000) & auVar192._0_4_;
            auVar279._4_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar192._4_4_;
            auVar279._8_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar192._8_4_;
            auVar279._12_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar192._12_4_;
            auVar271._0_4_ = ~auVar192._0_4_ & auVar254._0_4_;
            auVar271._4_4_ = ~auVar192._4_4_ & auVar254._4_4_;
            auVar271._8_4_ = ~auVar192._8_4_ & auVar254._8_4_;
            auVar271._12_4_ = ~auVar192._12_4_ & auVar254._12_4_;
            auVar254 = auVar271 | auVar279;
            auVar280._0_4_ = (uVar75 & 0x7f800000 | ~uVar75 & 0xff800000) & auVar192._0_4_;
            auVar280._4_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar192._4_4_;
            auVar280._8_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar192._8_4_;
            auVar280._12_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar192._12_4_;
            auVar202._0_4_ = ~auVar192._0_4_ & auVar145._0_4_;
            auVar202._4_4_ = ~auVar192._4_4_ & auVar145._4_4_;
            auVar202._8_4_ = ~auVar192._8_4_ & auVar145._8_4_;
            auVar202._12_4_ = ~auVar192._12_4_ & auVar145._12_4_;
            auVar145 = auVar202 | auVar280;
            local_428._4_4_ = -(uint)((fVar153 <= ABS(fVar261) || auVar144._4_4_ <= 0.0) && bVar74);
            local_428._0_4_ = -(uint)((fVar152 <= ABS(fVar260) || auVar144._0_4_ <= 0.0) && bVar23);
            fStack_420 = (float)-(uint)((fVar154 <= ABS(fVar281) || auVar144._8_4_ <= 0.0) && bVar24
                                       );
            fStack_41c = (float)-(uint)((fVar167 <= ABS(fVar292) || auVar144._12_4_ <= 0.0) &&
                                       bVar25);
          }
        }
        fVar152 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar153 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar154 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_408._4_4_ =
             -(uint)(0.3 <= ABS(fVar234 * fVar152 + fVar228 * fVar153 + auVar231._4_4_ * fVar154));
        local_408._0_4_ =
             -(uint)(0.3 <= ABS(fVar233 * fVar152 + fVar227 * fVar153 + auVar231._0_4_ * fVar154));
        fStack_400 = (float)-(uint)(0.3 <= ABS(fVar247 * fVar152 +
                                               fVar229 * fVar153 + auVar231._8_4_ * fVar154));
        fStack_3fc = (float)-(uint)(0.3 <= ABS(fVar248 * fVar152 +
                                               fVar232 * fVar153 + auVar231._12_4_ * fVar154));
        _local_118 = local_3c8;
        local_108 = minps(_local_518,auVar254);
        _local_268 = maxps(local_3c8,auVar145);
        local_258 = _local_518;
        auVar291._0_4_ = -(uint)(fVar184 <= local_108._0_4_) & auVar302._0_4_;
        auVar291._4_4_ = -(uint)(fVar185 <= local_108._4_4_) & auVar302._4_4_;
        auVar291._8_4_ = -(uint)(fVar186 <= local_108._8_4_) & auVar302._8_4_;
        auVar291._12_4_ = -(uint)(fVar169 <= local_108._12_4_) & auVar302._12_4_;
        local_318 = auVar291;
        _local_418 = _local_268;
        local_328._0_4_ = -(uint)(local_268._0_4_ <= local_518._0_4_) & auVar302._0_4_;
        local_328._4_4_ = -(uint)(local_268._4_4_ <= local_518._4_4_) & auVar302._4_4_;
        local_328._8_4_ = -(uint)(local_268._8_4_ <= local_518._8_4_) & auVar302._8_4_;
        local_328._12_4_ = -(uint)(local_268._12_4_ <= local_518._12_4_) & auVar302._12_4_;
        _local_2f8 = local_328;
        iVar61 = movmskps(iVar61,local_328 | auVar291);
        if (iVar61 != 0) {
          local_348 = (float)local_490;
          fStack_344 = (float)local_490;
          fStack_340 = (float)local_490;
          fStack_33c = (float)local_490;
          local_488._0_4_ =
               -(uint)((int)(float)local_490 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_488._0_4_ * fVar154 +
                                                 fVar125 * fVar153 + fVar168 * fVar152)) &
                             local_428._0_4_) << 0x1f) >> 0x1f) + 4);
          local_488._4_4_ =
               -(uint)((int)(float)local_490 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_488._4_4_ * fVar154 +
                                                 fVar203 * fVar153 + fVar80 * fVar152)) &
                             local_428._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_480 = (float)-(uint)((int)(float)local_490 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_480 * fVar154 +
                                                                fVar204 * fVar153 +
                                                                fVar120 * fVar152)) &
                                            (uint)fStack_420) << 0x1f) >> 0x1f) + 4);
          fStack_47c = (float)-(uint)((int)(float)local_490 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_47c * fVar154 +
                                                                fVar205 * fVar153 +
                                                                fVar122 * fVar152)) &
                                            (uint)fStack_41c) << 0x1f) >> 0x1f) + 4);
          local_318 = ~_local_488 & auVar291;
          iVar61 = movmskps(iVar61,local_318);
          _local_308 = auVar291;
          if (iVar61 != 0) {
            local_3d8 = local_3b8 + fVar184;
            fStack_3d4 = fStack_3b4 + fVar185;
            fStack_3d0 = fStack_3b0 + fVar186;
            fStack_3cc = fStack_3ac + fVar169;
            do {
              auVar156 = ~local_318 & _DAT_01feb9f0 | local_318 & local_3c8;
              auVar177._4_4_ = auVar156._0_4_;
              auVar177._0_4_ = auVar156._4_4_;
              auVar177._8_4_ = auVar156._12_4_;
              auVar177._12_4_ = auVar156._8_4_;
              auVar82 = minps(auVar177,auVar156);
              auVar146._0_8_ = auVar82._8_8_;
              auVar146._8_4_ = auVar82._0_4_;
              auVar146._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar146,auVar82);
              auVar147._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar156._4_4_) & local_318._4_4_,
                            -(uint)(auVar82._0_4_ == auVar156._0_4_) & local_318._0_4_);
              auVar147._8_4_ = -(uint)(auVar82._8_4_ == auVar156._8_4_) & local_318._8_4_;
              auVar147._12_4_ = -(uint)(auVar82._12_4_ == auVar156._12_4_) & local_318._12_4_;
              iVar61 = movmskps(iVar61,auVar147);
              auVar111 = local_318;
              if (iVar61 != 0) {
                auVar111._8_4_ = auVar147._8_4_;
                auVar111._0_8_ = auVar147._0_8_;
                auVar111._12_4_ = auVar147._12_4_;
              }
              uVar62 = movmskps(iVar61,auVar111);
              pRVar65 = (RayHit *)0x0;
              if (CONCAT44(uVar67,uVar62) != 0) {
                for (; (CONCAT44(uVar67,uVar62) >> (long)pRVar65 & 1) == 0;
                    pRVar65 = (RayHit *)((long)(pRVar65->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_318 + (long)pRVar65 * 4) = 0;
              fVar168 = local_2b8[(long)pRVar65];
              auVar245 = ZEXT416(*(uint *)(local_118 + (long)pRVar65 * 4));
              local_578 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_574 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_570 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_56c = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar80 = fStack_570 * fStack_570 + fStack_574 * fStack_574 + local_578 * local_578;
              if (fVar80 < 0.0) {
                fVar80 = sqrtf(fVar80);
                pRVar65 = extraout_RAX;
              }
              else {
                fVar80 = SQRT(fVar80);
              }
              auVar29._4_4_ = fStack_4f4;
              auVar29._0_4_ = local_4f8;
              auVar29._8_4_ = fStack_4f0;
              auVar29._12_4_ = fStack_4ec;
              auVar33._4_4_ = fStack_464;
              auVar33._0_4_ = local_468;
              auVar33._8_4_ = fStack_460;
              auVar33._12_4_ = fStack_45c;
              auVar156 = minps(auVar29,auVar33);
              auVar267 = maxps(auVar29,auVar33);
              auVar31._4_4_ = fStack_474;
              auVar31._0_4_ = local_478;
              auVar31._8_4_ = fStack_470;
              auVar31._12_4_ = fStack_46c;
              auVar82 = minps(auVar31,_local_558);
              auVar156 = minps(auVar156,auVar82);
              auVar82 = maxps(auVar31,_local_558);
              auVar82 = maxps(auVar267,auVar82);
              auVar193._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
              auVar193._8_4_ = auVar156._8_4_ & 0x7fffffff;
              auVar193._12_4_ = auVar156._12_4_ & 0x7fffffff;
              local_4b8._4_4_ = auVar82._12_4_;
              auVar112._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar112._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar112._12_4_ = local_4b8._4_4_ & 0x7fffffff;
              auVar82 = maxps(auVar193,auVar112);
              fVar120 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar120 = auVar82._0_4_;
              }
              auVar194._8_8_ = auVar82._8_8_;
              auVar194._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar120) {
                auVar194._0_4_ = fVar120;
              }
              register0x00001304 = auVar194._4_12_;
              local_588._0_4_ = auVar194._0_4_ * 1.9073486e-06;
              local_378 = fVar80 * 1.9073486e-06;
              local_4b8._0_4_ = local_4b8._4_4_;
              fStack_4b0 = (float)local_4b8._4_4_;
              fStack_4ac = (float)local_4b8._4_4_;
              lVar73 = 4;
              do {
                fVar80 = 1.0 - fVar168;
                fVar153 = local_468 * fVar80 + local_478 * fVar168;
                fVar167 = fStack_464 * fVar80 + fStack_474 * fVar168;
                fVar169 = fStack_460 * fVar80 + fStack_470 * fVar168;
                fVar184 = fStack_45c * fVar80 + fStack_46c * fVar168;
                fVar120 = (local_4f8 * fVar80 + local_468 * fVar168) * fVar80 + fVar168 * fVar153;
                fVar122 = (fStack_4f4 * fVar80 + fStack_464 * fVar168) * fVar80 + fVar168 * fVar167;
                fVar125 = (fStack_4f0 * fVar80 + fStack_460 * fVar168) * fVar80 + fVar168 * fVar169;
                fVar152 = (fStack_4ec * fVar80 + fStack_45c * fVar168) * fVar80 + fVar168 * fVar184;
                fVar154 = fVar153 * fVar80 +
                          (local_478 * fVar80 + (float)local_558._0_4_ * fVar168) * fVar168;
                fVar167 = fVar167 * fVar80 +
                          (fStack_474 * fVar80 + (float)local_558._4_4_ * fVar168) * fVar168;
                fVar169 = fVar169 * fVar80 + (fStack_470 * fVar80 + fStack_550 * fVar168) * fVar168;
                fVar184 = fVar184 * fVar80 + (fStack_46c * fVar80 + fStack_54c * fVar168) * fVar168;
                fVar153 = auVar245._0_4_;
                local_358._0_4_ = fVar80 * fVar120 + fVar168 * fVar154;
                local_358._4_4_ = fVar80 * fVar122 + fVar168 * fVar167;
                fStack_350 = fVar80 * fVar125 + fVar168 * fVar169;
                fStack_34c = fVar80 * fVar152 + fVar168 * fVar184;
                fVar154 = (fVar154 - fVar120) * 3.0;
                fVar167 = (fVar167 - fVar122) * 3.0;
                fVar169 = (fVar169 - fVar125) * 3.0;
                fVar152 = (fVar184 - fVar152) * 3.0;
                local_518._0_4_ = (fVar153 * local_578 + 0.0) - (float)local_358._0_4_;
                local_518._4_4_ = (fVar153 * fStack_574 + 0.0) - (float)local_358._4_4_;
                fStack_510 = (fVar153 * fStack_570 + 0.0) - fStack_350;
                fStack_50c = (fVar153 * fStack_56c + 0.0) - fStack_34c;
                fVar120 = (float)local_518._4_4_ * (float)local_518._4_4_;
                fVar122 = fStack_510 * fStack_510;
                fVar125 = fStack_50c * fStack_50c;
                local_568._0_4_ =
                     fVar120 + (float)local_518._0_4_ * (float)local_518._0_4_ + fVar122;
                local_568._4_4_ = fVar120 + fVar120 + fVar125;
                fStack_560 = fVar120 + fVar122 + fVar122;
                fStack_55c = fVar120 + fVar125 + fVar125;
                local_368 = (float)local_568._0_4_;
                if ((float)local_568._0_4_ < 0.0) {
                  local_5a8 = ZEXT416((uint)fVar80);
                  fVar120 = sqrtf((float)local_568._0_4_);
                  pRVar66 = extraout_RAX_00;
                  fVar80 = (float)local_5a8._0_4_;
                }
                else {
                  fVar120 = SQRT((float)local_568._0_4_);
                  pRVar66 = pRVar65;
                }
                fVar184 = fVar80 * 6.0;
                fVar122 = (fVar168 - (fVar80 + fVar80)) * 6.0;
                fVar125 = (fVar80 - (fVar168 + fVar168)) * 6.0;
                fVar80 = fVar168 * 6.0;
                fVar185 = fVar184 * local_4f8 +
                          fVar122 * local_468 +
                          fVar125 * local_478 + fVar80 * (float)local_558._0_4_;
                fVar186 = fVar184 * fStack_4f4 +
                          fVar122 * fStack_464 +
                          fVar125 * fStack_474 + fVar80 * (float)local_558._4_4_;
                fVar203 = fVar184 * fStack_4f0 +
                          fVar122 * fStack_460 + fVar125 * fStack_470 + fVar80 * fStack_550;
                local_4a8 = (float)local_588._0_4_;
                if ((float)local_588._0_4_ <= local_378 * fVar153) {
                  local_4a8 = local_378 * fVar153;
                }
                fVar204 = fVar167 * fVar167 + fVar154 * fVar154 + fVar169 * fVar169;
                auVar156 = ZEXT416((uint)fVar204);
                auVar82 = rsqrtss(ZEXT416((uint)fVar204),auVar156);
                fVar205 = auVar82._0_4_;
                fVar205 = fVar205 * fVar205 * fVar204 * -0.5 * fVar205 + fVar205 * 1.5;
                fVar227 = fVar169 * fVar203 + fVar167 * fVar186 + fVar154 * fVar185;
                auVar82 = rcpss(auVar156,auVar156);
                fVar228 = (2.0 - fVar204 * auVar82._0_4_) * auVar82._0_4_;
                local_548 = fVar228 * (fVar204 * fVar185 - fVar227 * fVar154) * fVar205;
                fStack_544 = fVar228 * (fVar204 * fVar186 - fVar227 * fVar167) * fVar205;
                fStack_540 = fVar228 * (fVar204 * fVar203 - fVar227 * fVar169) * fVar205;
                fStack_53c = fVar228 * (fVar204 * (fVar184 * fStack_4ec +
                                                  fVar122 * fStack_45c +
                                                  fVar125 * fStack_46c + fVar80 * fStack_54c) -
                                       fVar227 * fVar152) * fVar205;
                fStack_4a4 = (float)local_588._4_4_;
                fStack_4a0 = fStack_580;
                fStack_49c = fStack_57c;
                if (fVar204 < 0.0) {
                  local_5a8._0_4_ = fVar120;
                  local_538 = fVar154 * fVar205;
                  fStack_534 = fVar167 * fVar205;
                  fStack_530 = fVar169 * fVar205;
                  fStack_52c = fVar152 * fVar205;
                  local_528 = -fVar154;
                  fStack_524 = -fVar167;
                  fStack_520 = -fVar169;
                  fStack_51c = -fVar152;
                  fVar204 = sqrtf(fVar204);
                  pRVar66 = extraout_RAX_01;
                  fVar80 = local_528;
                  fVar122 = fStack_524;
                  fVar125 = fStack_520;
                  fVar184 = fStack_51c;
                  fVar120 = (float)local_5a8._0_4_;
                  fVar185 = local_538;
                  fVar186 = fStack_534;
                  fVar203 = fStack_530;
                  fVar205 = fStack_52c;
                }
                else {
                  fVar204 = SQRT(fVar204);
                  fVar80 = -fVar154;
                  fVar122 = -fVar167;
                  fVar125 = -fVar169;
                  fVar184 = -fVar152;
                  fVar185 = fVar154 * fVar205;
                  fVar186 = fVar167 * fVar205;
                  fVar203 = fVar169 * fVar205;
                  fVar205 = fVar152 * fVar205;
                }
                fVar227 = (float)local_518._4_4_ * fVar186;
                fVar232 = fStack_510 * fVar203;
                fVar233 = fStack_50c * fVar205;
                fVar229 = fVar227 + (float)local_518._0_4_ * fVar185 + fVar232;
                fVar234 = fVar227 + fVar227 + fVar233;
                fVar232 = fVar227 + fVar232 + fVar232;
                fVar233 = fVar227 + fVar233 + fVar233;
                fVar227 = (fVar120 + 1.0) * ((float)local_588._0_4_ / fVar204) +
                          fVar120 * (float)local_588._0_4_ + local_4a8;
                fVar204 = fStack_56c * fVar205;
                fVar205 = fVar205 * fVar184;
                fVar228 = fVar203 * fVar125 + fVar186 * fVar122 + fVar185 * fVar80 +
                          fStack_540 * fStack_510 +
                          fStack_544 * (float)local_518._4_4_ + local_548 * (float)local_518._0_4_;
                fVar120 = fStack_570 * fVar203 + fStack_574 * fVar186 + local_578 * fVar185;
                fVar185 = local_568._0_4_ - fVar229 * fVar229;
                auVar113._0_8_ = CONCAT44(local_568._4_4_ - fVar234 * fVar234,fVar185);
                auVar113._8_4_ = local_568._8_4_ - fVar232 * fVar232;
                auVar113._12_4_ = local_568._12_4_ - fVar233 * fVar233;
                fVar184 = fVar184 * fStack_50c;
                fVar80 = (fVar125 * fStack_510 +
                         fVar122 * (float)local_518._4_4_ + fVar80 * (float)local_518._0_4_) -
                         fVar229 * fVar228;
                fStack_540 = fStack_570 * fStack_510;
                fStack_544 = fStack_56c * fStack_50c;
                local_548 = (fStack_540 +
                            fStack_574 * (float)local_518._4_4_ + local_578 * (float)local_518._0_4_
                            ) - fVar229 * fVar120;
                auVar178._8_4_ = auVar113._8_4_;
                auVar178._0_8_ = auVar113._0_8_;
                auVar178._12_4_ = auVar113._12_4_;
                auVar82 = rsqrtss(auVar178,auVar113);
                fVar122 = auVar82._0_4_;
                auVar179._4_12_ = auVar82._4_12_;
                auVar179._0_4_ = fVar122 * fVar122 * fVar185 * -0.5 * fVar122 + fVar122 * 1.5;
                fStack_53c = fStack_544;
                if (fVar185 < 0.0) {
                  local_5a8._0_4_ = fVar227;
                  local_538 = fVar228;
                  fStack_534 = fVar205;
                  fStack_530 = fVar203 * fVar125;
                  fStack_52c = fVar205;
                  local_528 = fVar80;
                  fStack_524 = fVar184;
                  fStack_520 = fVar125 * fStack_510;
                  fStack_51c = fVar184;
                  _local_3a8 = auVar179;
                  local_398 = fVar120;
                  fStack_394 = fVar204;
                  fStack_390 = fStack_570 * fVar203;
                  fStack_38c = fVar204;
                  local_388 = fVar229;
                  fStack_384 = fVar234;
                  fStack_380 = fVar232;
                  fStack_37c = fVar233;
                  fVar185 = sqrtf(fVar185);
                  pRVar66 = extraout_RAX_02;
                  auVar179 = _local_3a8;
                  fVar120 = local_398;
                  fVar204 = fStack_394;
                  fVar80 = local_528;
                  fVar184 = fStack_524;
                  fVar227 = (float)local_5a8._0_4_;
                  fVar228 = local_538;
                  fVar205 = fStack_534;
                  fVar229 = local_388;
                }
                else {
                  fVar185 = SQRT(fVar185);
                }
                fVar185 = fVar185 - fStack_34c;
                fVar80 = fVar80 * auVar179._0_4_ - fVar152;
                auVar27._4_4_ = fStack_544;
                auVar27._0_4_ = local_548;
                auVar27._8_4_ = fStack_540;
                auVar27._12_4_ = fStack_53c;
                auVar157._4_12_ = auVar27._4_12_;
                auVar157._0_4_ = local_548 * auVar179._0_4_;
                auVar256._0_8_ = CONCAT44(fVar184,fVar80) ^ 0x8000000080000000;
                auVar256._8_4_ = -fVar184;
                auVar256._12_4_ = fVar205;
                auVar255._8_8_ = auVar256._8_8_;
                auVar255._0_8_ = CONCAT44(fVar228,fVar80) ^ 0x80000000;
                auVar303._0_4_ = fVar228 * auVar157._0_4_ - fVar120 * fVar80;
                auVar159._0_8_ = auVar157._0_8_;
                auVar159._8_4_ = fStack_544;
                auVar159._12_4_ = -fVar204;
                auVar158._8_8_ = auVar159._8_8_;
                auVar158._0_8_ = CONCAT44(fVar120,auVar157._0_4_) ^ 0x8000000000000000;
                auVar303._4_4_ = auVar303._0_4_;
                auVar303._8_4_ = auVar303._0_4_;
                auVar303._12_4_ = auVar303._0_4_;
                auVar82 = divps(auVar158,auVar303);
                auVar156 = divps(auVar255,auVar303);
                fVar168 = fVar168 - (auVar82._4_4_ * fVar185 + auVar82._0_4_ * fVar229);
                auVar245._0_4_ = fVar153 - (auVar156._4_4_ * fVar185 + auVar156._0_4_ * fVar229);
                if ((fVar227 <= ABS(fVar229)) ||
                   ((float)local_4b8._0_4_ * 1.9073486e-06 + local_4a8 + fVar227 <= ABS(fVar185))) {
                  bVar23 = false;
                }
                else {
                  auVar245._0_4_ = auVar245._0_4_ + (float)local_2d8._0_4_;
                  bVar23 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= auVar245._0_4_) &&
                       (fVar80 = (ray->super_RayK<1>).tfar, auVar245._0_4_ <= fVar80)) &&
                      (0.0 <= fVar168)) && (fVar168 <= 1.0)) {
                    auVar82 = rsqrtss(_local_568,_local_568);
                    fVar120 = auVar82._0_4_;
                    pGVar19 = (context->scene->geometries).items[(long)local_590].ptr;
                    uVar75 = (ray->super_RayK<1>).mask;
                    pRVar66 = (RayHit *)(ulong)uVar75;
                    pRVar68 = local_590;
                    if ((pGVar19->mask & uVar75) != 0) {
                      fVar120 = fVar120 * 1.5 + fVar120 * fVar120 * local_368 * -0.5 * fVar120;
                      fVar153 = (float)local_518._0_4_ * fVar120;
                      fVar185 = (float)local_518._4_4_ * fVar120;
                      fVar120 = fStack_510 * fVar120;
                      fVar125 = fVar152 * fVar153 + fVar154;
                      fVar122 = fVar152 * fVar185 + fVar167;
                      fVar152 = fVar152 * fVar120 + fVar169;
                      fVar184 = fVar185 * fVar154 - fVar167 * fVar153;
                      fVar167 = fVar120 * fVar167 - fVar169 * fVar185;
                      fVar153 = fVar153 * fVar169 - fVar154 * fVar120;
                      fVar120 = fVar122 * fVar167 - fVar153 * fVar125;
                      fVar122 = fVar152 * fVar153 - fVar184 * fVar122;
                      fVar125 = fVar125 * fVar184 - fVar167 * fVar152;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = auVar245._0_4_;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar125,fVar122);
                        (ray->Ng).field_0.field_0.z = fVar120;
                        ray->u = fVar168;
                        ray->v = 0.0;
                        ray->primID = (uint)local_500;
                        ray->geomID = (uint)local_590;
                        ray->instID[0] = context->user->instID[0];
                        uVar75 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar75;
                        pRVar66 = (RayHit *)(ulong)uVar75;
                      }
                      else {
                        local_458 = CONCAT44(fVar125,fVar122);
                        fStack_450 = fVar120;
                        fStack_44c = fVar168;
                        local_448 = 0;
                        local_444 = (uint)local_500;
                        local_440 = (uint)local_590;
                        local_43c = context->user->instID[0];
                        pRVar68 = (RTCIntersectArguments *)(ulong)local_43c;
                        local_438 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = auVar245._0_4_;
                        local_5ac = 0xffffffff;
                        local_4e8.geometryUserPtr = pGVar19->userPtr;
                        local_4e8.valid = &local_5ac;
                        local_4e8.context = context->user;
                        local_4e8.hit = (RTCHitN *)&local_458;
                        local_4e8.N = 1;
                        local_4e8.ray = (RTCRayN *)ray;
                        if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bb9481:
                          pRVar68 = context->args;
                          if (pRVar68->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar68->filter)(&local_4e8);
                            }
                            if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00bb9529;
                          }
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4e8.hit;
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4e8.hit + 4);
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4e8.hit + 8);
                          *(float *)((long)local_4e8.ray + 0x3c) = *(float *)(local_4e8.hit + 0xc);
                          *(float *)((long)local_4e8.ray + 0x40) = *(float *)(local_4e8.hit + 0x10);
                          *(float *)((long)local_4e8.ray + 0x44) = *(float *)(local_4e8.hit + 0x14);
                          *(float *)((long)local_4e8.ray + 0x48) = *(float *)(local_4e8.hit + 0x18);
                          *(float *)((long)local_4e8.ray + 0x4c) = *(float *)(local_4e8.hit + 0x1c);
                          pRVar68 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4e8.hit + 0x20);
                          *(float *)((long)local_4e8.ray + 0x50) = *(float *)(local_4e8.hit + 0x20);
                          pRVar66 = (RayHit *)local_4e8.ray;
                        }
                        else {
                          (*pGVar19->intersectionFilterN)(&local_4e8);
                          if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00bb9481;
LAB_00bb9529:
                          (ray->super_RayK<1>).tfar = fVar80;
                          pRVar66 = (RayHit *)local_4e8.valid;
                        }
                      }
                    }
                  }
                }
                bVar74 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                pRVar65 = (RayHit *)CONCAT71((int7)((ulong)pRVar66 >> 8),bVar74);
              } while ((!bVar23) && (!bVar74));
              fVar168 = (ray->super_RayK<1>).tfar;
              local_318._0_4_ = -(uint)(local_3d8 <= fVar168) & local_318._0_4_;
              local_318._4_4_ = -(uint)(fStack_3d4 <= fVar168) & local_318._4_4_;
              local_318._8_4_ = -(uint)(fStack_3d0 <= fVar168) & local_318._8_4_;
              local_318._12_4_ = -(uint)(fStack_3cc <= fVar168) & local_318._12_4_;
              uVar67 = (undefined4)((ulong)pRVar66 >> 0x20);
              iVar61 = movmskps((int)pRVar65,local_318);
            } while (iVar61 != 0);
          }
          fVar168 = (ray->super_RayK<1>).tfar;
          local_418._0_4_ = -(uint)((float)local_418._0_4_ + local_3b8 <= fVar168) & local_2f8._0_4_
          ;
          local_418._4_4_ =
               -(uint)((float)local_418._4_4_ + fStack_3b4 <= fVar168) & local_2f8._4_4_;
          fStack_410 = (float)(-(uint)(fStack_410 + fStack_3b0 <= fVar168) & (uint)fStack_2f0);
          fStack_40c = (float)(-(uint)(fStack_40c + fStack_3ac <= fVar168) & (uint)fStack_2ec);
          local_408._0_4_ =
               -(uint)((int)local_348 <
                      ((int)((local_408._0_4_ & local_428._0_4_) << 0x1f) >> 0x1f) + 4);
          local_408._4_4_ =
               -(uint)((int)fStack_344 <
                      ((int)((local_408._4_4_ & local_428._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_400 = (float)-(uint)((int)fStack_340 <
                                     ((int)(((uint)fStack_400 & (uint)fStack_420) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_3fc = (float)-(uint)((int)fStack_33c <
                                     ((int)(((uint)fStack_3fc & (uint)fStack_41c) << 0x1f) >> 0x1f)
                                     + 4);
          local_328 = ~_local_408 & _local_418;
          iVar61 = movmskps(iVar61,local_328);
          if (iVar61 != 0) {
            local_3c8 = _local_268;
            local_3d8 = local_3b8 + (float)local_268._0_4_;
            fStack_3d4 = fStack_3b4 + (float)local_268._4_4_;
            fStack_3d0 = fStack_3b0 + fStack_260;
            fStack_3cc = fStack_3ac + fStack_25c;
            do {
              auVar156 = ~local_328 & _DAT_01feb9f0 | local_328 & local_3c8;
              auVar180._4_4_ = auVar156._0_4_;
              auVar180._0_4_ = auVar156._4_4_;
              auVar180._8_4_ = auVar156._12_4_;
              auVar180._12_4_ = auVar156._8_4_;
              auVar82 = minps(auVar180,auVar156);
              auVar148._0_8_ = auVar82._8_8_;
              auVar148._8_4_ = auVar82._0_4_;
              auVar148._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar148,auVar82);
              auVar149._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar156._4_4_) & local_328._4_4_,
                            -(uint)(auVar82._0_4_ == auVar156._0_4_) & local_328._0_4_);
              auVar149._8_4_ = -(uint)(auVar82._8_4_ == auVar156._8_4_) & local_328._8_4_;
              auVar149._12_4_ = -(uint)(auVar82._12_4_ == auVar156._12_4_) & local_328._12_4_;
              iVar61 = movmskps(iVar61,auVar149);
              auVar114 = local_328;
              if (iVar61 != 0) {
                auVar114._8_4_ = auVar149._8_4_;
                auVar114._0_8_ = auVar149._0_8_;
                auVar114._12_4_ = auVar149._12_4_;
              }
              uVar62 = movmskps(iVar61,auVar114);
              pRVar65 = (RayHit *)0x0;
              if (CONCAT44(uVar67,uVar62) != 0) {
                for (; (CONCAT44(uVar67,uVar62) >> (long)pRVar65 & 1) == 0;
                    pRVar65 = (RayHit *)((long)(pRVar65->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_328 + (long)pRVar65 * 4) = 0;
              fVar168 = local_2c8[(long)pRVar65];
              auVar246 = ZEXT416(*(uint *)(local_258 + (long)pRVar65 * 4));
              local_578 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_574 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_570 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_56c = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar80 = fStack_570 * fStack_570 + fStack_574 * fStack_574 + local_578 * local_578;
              if (fVar80 < 0.0) {
                fVar80 = sqrtf(fVar80);
                pRVar65 = extraout_RAX_03;
              }
              else {
                fVar80 = SQRT(fVar80);
              }
              auVar30._4_4_ = fStack_4f4;
              auVar30._0_4_ = local_4f8;
              auVar30._8_4_ = fStack_4f0;
              auVar30._12_4_ = fStack_4ec;
              auVar34._4_4_ = fStack_464;
              auVar34._0_4_ = local_468;
              auVar34._8_4_ = fStack_460;
              auVar34._12_4_ = fStack_45c;
              auVar156 = minps(auVar30,auVar34);
              auVar267 = maxps(auVar30,auVar34);
              auVar32._4_4_ = fStack_474;
              auVar32._0_4_ = local_478;
              auVar32._8_4_ = fStack_470;
              auVar32._12_4_ = fStack_46c;
              auVar82 = minps(auVar32,_local_558);
              auVar156 = minps(auVar156,auVar82);
              auVar82 = maxps(auVar32,_local_558);
              auVar82 = maxps(auVar267,auVar82);
              auVar195._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
              auVar195._8_4_ = auVar156._8_4_ & 0x7fffffff;
              auVar195._12_4_ = auVar156._12_4_ & 0x7fffffff;
              local_4b8._4_4_ = auVar82._12_4_;
              auVar115._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar115._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar115._12_4_ = local_4b8._4_4_ & 0x7fffffff;
              auVar82 = maxps(auVar195,auVar115);
              fVar120 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar120 = auVar82._0_4_;
              }
              auVar196._8_8_ = auVar82._8_8_;
              auVar196._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar120) {
                auVar196._0_4_ = fVar120;
              }
              register0x00001304 = auVar196._4_12_;
              local_588._0_4_ = auVar196._0_4_ * 1.9073486e-06;
              local_378 = fVar80 * 1.9073486e-06;
              local_4b8._0_4_ = local_4b8._4_4_;
              fStack_4b0 = (float)local_4b8._4_4_;
              fStack_4ac = (float)local_4b8._4_4_;
              lVar73 = 4;
              do {
                fVar80 = 1.0 - fVar168;
                fVar153 = local_468 * fVar80 + local_478 * fVar168;
                fVar167 = fStack_464 * fVar80 + fStack_474 * fVar168;
                fVar169 = fStack_460 * fVar80 + fStack_470 * fVar168;
                fVar184 = fStack_45c * fVar80 + fStack_46c * fVar168;
                fVar120 = (local_4f8 * fVar80 + local_468 * fVar168) * fVar80 + fVar168 * fVar153;
                fVar122 = (fStack_4f4 * fVar80 + fStack_464 * fVar168) * fVar80 + fVar168 * fVar167;
                fVar125 = (fStack_4f0 * fVar80 + fStack_460 * fVar168) * fVar80 + fVar168 * fVar169;
                fVar152 = (fStack_4ec * fVar80 + fStack_45c * fVar168) * fVar80 + fVar168 * fVar184;
                fVar154 = fVar153 * fVar80 +
                          (local_478 * fVar80 + (float)local_558._0_4_ * fVar168) * fVar168;
                fVar167 = fVar167 * fVar80 +
                          (fStack_474 * fVar80 + (float)local_558._4_4_ * fVar168) * fVar168;
                fVar169 = fVar169 * fVar80 + (fStack_470 * fVar80 + fStack_550 * fVar168) * fVar168;
                fVar184 = fVar184 * fVar80 + (fStack_46c * fVar80 + fStack_54c * fVar168) * fVar168;
                fVar153 = auVar246._0_4_;
                local_358._0_4_ = fVar80 * fVar120 + fVar168 * fVar154;
                local_358._4_4_ = fVar80 * fVar122 + fVar168 * fVar167;
                fStack_350 = fVar80 * fVar125 + fVar168 * fVar169;
                fStack_34c = fVar80 * fVar152 + fVar168 * fVar184;
                fVar154 = (fVar154 - fVar120) * 3.0;
                fVar167 = (fVar167 - fVar122) * 3.0;
                fVar169 = (fVar169 - fVar125) * 3.0;
                fVar152 = (fVar184 - fVar152) * 3.0;
                local_518._0_4_ = (fVar153 * local_578 + 0.0) - (float)local_358._0_4_;
                local_518._4_4_ = (fVar153 * fStack_574 + 0.0) - (float)local_358._4_4_;
                fStack_510 = (fVar153 * fStack_570 + 0.0) - fStack_350;
                fStack_50c = (fVar153 * fStack_56c + 0.0) - fStack_34c;
                fVar120 = (float)local_518._4_4_ * (float)local_518._4_4_;
                fVar122 = fStack_510 * fStack_510;
                fVar125 = fStack_50c * fStack_50c;
                local_568._0_4_ =
                     fVar120 + (float)local_518._0_4_ * (float)local_518._0_4_ + fVar122;
                local_568._4_4_ = fVar120 + fVar120 + fVar125;
                fStack_560 = fVar120 + fVar122 + fVar122;
                fStack_55c = fVar120 + fVar125 + fVar125;
                local_368 = (float)local_568._0_4_;
                if ((float)local_568._0_4_ < 0.0) {
                  local_5a8 = ZEXT416((uint)fVar80);
                  fVar120 = sqrtf((float)local_568._0_4_);
                  pRVar66 = extraout_RAX_04;
                  fVar80 = (float)local_5a8._0_4_;
                }
                else {
                  fVar120 = SQRT((float)local_568._0_4_);
                  pRVar66 = pRVar65;
                }
                fVar184 = fVar80 * 6.0;
                fVar122 = (fVar168 - (fVar80 + fVar80)) * 6.0;
                fVar125 = (fVar80 - (fVar168 + fVar168)) * 6.0;
                fVar80 = fVar168 * 6.0;
                fVar185 = fVar184 * local_4f8 +
                          fVar122 * local_468 +
                          fVar125 * local_478 + fVar80 * (float)local_558._0_4_;
                fVar186 = fVar184 * fStack_4f4 +
                          fVar122 * fStack_464 +
                          fVar125 * fStack_474 + fVar80 * (float)local_558._4_4_;
                fVar203 = fVar184 * fStack_4f0 +
                          fVar122 * fStack_460 + fVar125 * fStack_470 + fVar80 * fStack_550;
                local_4a8 = (float)local_588._0_4_;
                if ((float)local_588._0_4_ <= local_378 * fVar153) {
                  local_4a8 = local_378 * fVar153;
                }
                fVar204 = fVar167 * fVar167 + fVar154 * fVar154 + fVar169 * fVar169;
                auVar156 = ZEXT416((uint)fVar204);
                auVar82 = rsqrtss(ZEXT416((uint)fVar204),auVar156);
                fVar205 = auVar82._0_4_;
                fVar205 = fVar205 * fVar205 * fVar204 * -0.5 * fVar205 + fVar205 * 1.5;
                fVar227 = fVar169 * fVar203 + fVar167 * fVar186 + fVar154 * fVar185;
                auVar82 = rcpss(auVar156,auVar156);
                fVar228 = (2.0 - fVar204 * auVar82._0_4_) * auVar82._0_4_;
                local_548 = fVar228 * (fVar204 * fVar185 - fVar227 * fVar154) * fVar205;
                fStack_544 = fVar228 * (fVar204 * fVar186 - fVar227 * fVar167) * fVar205;
                fStack_540 = fVar228 * (fVar204 * fVar203 - fVar227 * fVar169) * fVar205;
                fStack_53c = fVar228 * (fVar204 * (fVar184 * fStack_4ec +
                                                  fVar122 * fStack_45c +
                                                  fVar125 * fStack_46c + fVar80 * fStack_54c) -
                                       fVar227 * fVar152) * fVar205;
                fStack_4a4 = (float)local_588._4_4_;
                fStack_4a0 = fStack_580;
                fStack_49c = fStack_57c;
                if (fVar204 < 0.0) {
                  local_5a8._0_4_ = fVar120;
                  local_538 = fVar154 * fVar205;
                  fStack_534 = fVar167 * fVar205;
                  fStack_530 = fVar169 * fVar205;
                  fStack_52c = fVar152 * fVar205;
                  local_528 = -fVar154;
                  fStack_524 = -fVar167;
                  fStack_520 = -fVar169;
                  fStack_51c = -fVar152;
                  fVar204 = sqrtf(fVar204);
                  pRVar66 = extraout_RAX_05;
                  fVar80 = local_528;
                  fVar122 = fStack_524;
                  fVar125 = fStack_520;
                  fVar184 = fStack_51c;
                  fVar120 = (float)local_5a8._0_4_;
                  fVar185 = local_538;
                  fVar186 = fStack_534;
                  fVar203 = fStack_530;
                  fVar205 = fStack_52c;
                }
                else {
                  fVar204 = SQRT(fVar204);
                  fVar80 = -fVar154;
                  fVar122 = -fVar167;
                  fVar125 = -fVar169;
                  fVar184 = -fVar152;
                  fVar185 = fVar154 * fVar205;
                  fVar186 = fVar167 * fVar205;
                  fVar203 = fVar169 * fVar205;
                  fVar205 = fVar152 * fVar205;
                }
                fVar227 = (float)local_518._4_4_ * fVar186;
                fVar232 = fStack_510 * fVar203;
                fVar233 = fStack_50c * fVar205;
                fVar229 = fVar227 + (float)local_518._0_4_ * fVar185 + fVar232;
                fVar234 = fVar227 + fVar227 + fVar233;
                fVar232 = fVar227 + fVar232 + fVar232;
                fVar233 = fVar227 + fVar233 + fVar233;
                fVar227 = (fVar120 + 1.0) * ((float)local_588._0_4_ / fVar204) +
                          fVar120 * (float)local_588._0_4_ + local_4a8;
                fVar204 = fStack_56c * fVar205;
                fVar205 = fVar205 * fVar184;
                fVar228 = fVar203 * fVar125 + fVar186 * fVar122 + fVar185 * fVar80 +
                          fStack_540 * fStack_510 +
                          fStack_544 * (float)local_518._4_4_ + local_548 * (float)local_518._0_4_;
                fVar120 = fStack_570 * fVar203 + fStack_574 * fVar186 + local_578 * fVar185;
                fVar185 = local_568._0_4_ - fVar229 * fVar229;
                auVar116._0_8_ = CONCAT44(local_568._4_4_ - fVar234 * fVar234,fVar185);
                auVar116._8_4_ = local_568._8_4_ - fVar232 * fVar232;
                auVar116._12_4_ = local_568._12_4_ - fVar233 * fVar233;
                fVar184 = fVar184 * fStack_50c;
                fVar80 = (fVar125 * fStack_510 +
                         fVar122 * (float)local_518._4_4_ + fVar80 * (float)local_518._0_4_) -
                         fVar229 * fVar228;
                fStack_540 = fStack_570 * fStack_510;
                fStack_544 = fStack_56c * fStack_50c;
                local_548 = (fStack_540 +
                            fStack_574 * (float)local_518._4_4_ + local_578 * (float)local_518._0_4_
                            ) - fVar229 * fVar120;
                auVar181._8_4_ = auVar116._8_4_;
                auVar181._0_8_ = auVar116._0_8_;
                auVar181._12_4_ = auVar116._12_4_;
                auVar82 = rsqrtss(auVar181,auVar116);
                fVar122 = auVar82._0_4_;
                auVar182._4_12_ = auVar82._4_12_;
                auVar182._0_4_ = fVar122 * fVar122 * fVar185 * -0.5 * fVar122 + fVar122 * 1.5;
                fStack_53c = fStack_544;
                if (fVar185 < 0.0) {
                  local_5a8._0_4_ = fVar227;
                  local_538 = fVar228;
                  fStack_534 = fVar205;
                  fStack_530 = fVar203 * fVar125;
                  fStack_52c = fVar205;
                  local_528 = fVar80;
                  fStack_524 = fVar184;
                  fStack_520 = fVar125 * fStack_510;
                  fStack_51c = fVar184;
                  _local_3a8 = auVar182;
                  local_398 = fVar120;
                  fStack_394 = fVar204;
                  fStack_390 = fStack_570 * fVar203;
                  fStack_38c = fVar204;
                  local_388 = fVar229;
                  fStack_384 = fVar234;
                  fStack_380 = fVar232;
                  fStack_37c = fVar233;
                  fVar185 = sqrtf(fVar185);
                  pRVar66 = extraout_RAX_06;
                  auVar182 = _local_3a8;
                  fVar120 = local_398;
                  fVar204 = fStack_394;
                  fVar80 = local_528;
                  fVar184 = fStack_524;
                  fVar227 = (float)local_5a8._0_4_;
                  fVar228 = local_538;
                  fVar205 = fStack_534;
                  fVar229 = local_388;
                }
                else {
                  fVar185 = SQRT(fVar185);
                }
                fVar185 = fVar185 - fStack_34c;
                fVar80 = fVar80 * auVar182._0_4_ - fVar152;
                auVar28._4_4_ = fStack_544;
                auVar28._0_4_ = local_548;
                auVar28._8_4_ = fStack_540;
                auVar28._12_4_ = fStack_53c;
                auVar160._4_12_ = auVar28._4_12_;
                auVar160._0_4_ = local_548 * auVar182._0_4_;
                auVar258._0_8_ = CONCAT44(fVar184,fVar80) ^ 0x8000000080000000;
                auVar258._8_4_ = -fVar184;
                auVar258._12_4_ = fVar205;
                auVar257._8_8_ = auVar258._8_8_;
                auVar257._0_8_ = CONCAT44(fVar228,fVar80) ^ 0x80000000;
                auVar304._0_4_ = fVar228 * auVar160._0_4_ - fVar120 * fVar80;
                auVar162._0_8_ = auVar160._0_8_;
                auVar162._8_4_ = fStack_544;
                auVar162._12_4_ = -fVar204;
                auVar161._8_8_ = auVar162._8_8_;
                auVar161._0_8_ = CONCAT44(fVar120,auVar160._0_4_) ^ 0x8000000000000000;
                auVar304._4_4_ = auVar304._0_4_;
                auVar304._8_4_ = auVar304._0_4_;
                auVar304._12_4_ = auVar304._0_4_;
                auVar82 = divps(auVar161,auVar304);
                auVar156 = divps(auVar257,auVar304);
                fVar168 = fVar168 - (auVar82._4_4_ * fVar185 + auVar82._0_4_ * fVar229);
                auVar246._0_4_ = fVar153 - (auVar156._4_4_ * fVar185 + auVar156._0_4_ * fVar229);
                if ((fVar227 <= ABS(fVar229)) ||
                   ((float)local_4b8._0_4_ * 1.9073486e-06 + local_4a8 + fVar227 <= ABS(fVar185))) {
                  bVar23 = false;
                }
                else {
                  auVar246._0_4_ = auVar246._0_4_ + (float)local_2d8._0_4_;
                  bVar23 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= auVar246._0_4_) &&
                       (fVar80 = (ray->super_RayK<1>).tfar, auVar246._0_4_ <= fVar80)) &&
                      (0.0 <= fVar168)) && (fVar168 <= 1.0)) {
                    auVar82 = rsqrtss(_local_568,_local_568);
                    fVar120 = auVar82._0_4_;
                    pGVar19 = (context->scene->geometries).items[(long)local_590].ptr;
                    uVar75 = (ray->super_RayK<1>).mask;
                    pRVar66 = (RayHit *)(ulong)uVar75;
                    pRVar68 = local_590;
                    if ((pGVar19->mask & uVar75) != 0) {
                      fVar120 = fVar120 * 1.5 + fVar120 * fVar120 * local_368 * -0.5 * fVar120;
                      fVar153 = (float)local_518._0_4_ * fVar120;
                      fVar185 = (float)local_518._4_4_ * fVar120;
                      fVar120 = fStack_510 * fVar120;
                      fVar125 = fVar152 * fVar153 + fVar154;
                      fVar122 = fVar152 * fVar185 + fVar167;
                      fVar152 = fVar152 * fVar120 + fVar169;
                      fVar184 = fVar185 * fVar154 - fVar167 * fVar153;
                      fVar167 = fVar120 * fVar167 - fVar169 * fVar185;
                      fVar153 = fVar153 * fVar169 - fVar154 * fVar120;
                      fVar120 = fVar122 * fVar167 - fVar153 * fVar125;
                      fVar122 = fVar152 * fVar153 - fVar184 * fVar122;
                      fVar125 = fVar125 * fVar184 - fVar167 * fVar152;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = auVar246._0_4_;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar125,fVar122);
                        (ray->Ng).field_0.field_0.z = fVar120;
                        ray->u = fVar168;
                        ray->v = 0.0;
                        ray->primID = (uint)local_500;
                        ray->geomID = (uint)local_590;
                        ray->instID[0] = context->user->instID[0];
                        uVar75 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar75;
                        pRVar66 = (RayHit *)(ulong)uVar75;
                      }
                      else {
                        local_458 = CONCAT44(fVar125,fVar122);
                        fStack_450 = fVar120;
                        fStack_44c = fVar168;
                        local_448 = 0;
                        local_444 = (uint)local_500;
                        local_440 = (uint)local_590;
                        local_43c = context->user->instID[0];
                        pRVar68 = (RTCIntersectArguments *)(ulong)local_43c;
                        local_438 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = auVar246._0_4_;
                        local_5ac = 0xffffffff;
                        local_4e8.geometryUserPtr = pGVar19->userPtr;
                        local_4e8.valid = &local_5ac;
                        local_4e8.context = context->user;
                        local_4e8.hit = (RTCHitN *)&local_458;
                        local_4e8.N = 1;
                        local_4e8.ray = (RTCRayN *)ray;
                        if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bb9f4b:
                          pRVar68 = context->args;
                          if (pRVar68->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar68->filter)(&local_4e8);
                            }
                            if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00bb9ff3;
                          }
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4e8.hit;
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4e8.hit + 4);
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4e8.hit + 8);
                          *(float *)((long)local_4e8.ray + 0x3c) = *(float *)(local_4e8.hit + 0xc);
                          *(float *)((long)local_4e8.ray + 0x40) = *(float *)(local_4e8.hit + 0x10);
                          *(float *)((long)local_4e8.ray + 0x44) = *(float *)(local_4e8.hit + 0x14);
                          *(float *)((long)local_4e8.ray + 0x48) = *(float *)(local_4e8.hit + 0x18);
                          *(float *)((long)local_4e8.ray + 0x4c) = *(float *)(local_4e8.hit + 0x1c);
                          pRVar68 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4e8.hit + 0x20);
                          *(float *)((long)local_4e8.ray + 0x50) = *(float *)(local_4e8.hit + 0x20);
                          pRVar66 = (RayHit *)local_4e8.ray;
                        }
                        else {
                          (*pGVar19->intersectionFilterN)(&local_4e8);
                          if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00bb9f4b;
LAB_00bb9ff3:
                          (ray->super_RayK<1>).tfar = fVar80;
                          pRVar66 = (RayHit *)local_4e8.valid;
                        }
                      }
                    }
                  }
                }
                bVar74 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                pRVar65 = (RayHit *)CONCAT71((int7)((ulong)pRVar66 >> 8),bVar74);
              } while ((!bVar23) && (!bVar74));
              fVar168 = (ray->super_RayK<1>).tfar;
              local_328._0_4_ = -(uint)(local_3d8 <= fVar168) & local_328._0_4_;
              local_328._4_4_ = -(uint)(fStack_3d4 <= fVar168) & local_328._4_4_;
              local_328._8_4_ = -(uint)(fStack_3d0 <= fVar168) & local_328._8_4_;
              local_328._12_4_ = -(uint)(fStack_3cc <= fVar168) & local_328._12_4_;
              uVar67 = (undefined4)((ulong)pRVar66 >> 0x20);
              iVar61 = movmskps((int)pRVar65,local_328);
            } while (iVar61 != 0);
          }
          fVar168 = (ray->super_RayK<1>).tfar;
          auVar197._0_4_ =
               local_488._0_4_ & local_308._0_4_ &
               -(uint)(local_3b8 + (float)local_118._0_4_ <= fVar168);
          auVar197._4_4_ =
               local_488._4_4_ & local_308._4_4_ &
               -(uint)(fStack_3b4 + (float)local_118._4_4_ <= fVar168);
          auVar197._8_4_ =
               (uint)fStack_480 & (uint)fStack_300 & -(uint)(fStack_3b0 + fStack_110 <= fVar168);
          auVar197._12_4_ =
               (uint)fStack_47c & (uint)fStack_2fc & -(uint)(fStack_3ac + fStack_10c <= fVar168);
          auVar163._0_4_ =
               local_408._0_4_ & local_418._0_4_ &
               -(uint)(local_3b8 + (float)local_268._0_4_ <= fVar168);
          auVar163._4_4_ =
               local_408._4_4_ & local_418._4_4_ &
               -(uint)(fStack_3b4 + (float)local_268._4_4_ <= fVar168);
          auVar163._8_4_ =
               (uint)fStack_400 & (uint)fStack_410 & -(uint)(fStack_3b0 + fStack_260 <= fVar168);
          auVar163._12_4_ =
               (uint)fStack_3fc & (uint)fStack_40c & -(uint)(fStack_3ac + fStack_25c <= fVar168);
          iVar61 = movmskps(iVar61,auVar163 | auVar197);
          if (iVar61 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar69 * 0xc) = auVar163 | auVar197;
            auVar117._0_4_ = local_118._0_4_ & auVar197._0_4_;
            auVar117._4_4_ = local_118._4_4_ & auVar197._4_4_;
            auVar117._8_4_ = (uint)fStack_110 & auVar197._8_4_;
            auVar117._12_4_ = (uint)fStack_10c & auVar197._12_4_;
            auVar198._0_4_ = ~auVar197._0_4_ & local_268._0_4_;
            auVar198._4_4_ = ~auVar197._4_4_ & local_268._4_4_;
            auVar198._8_4_ = ~auVar197._8_4_ & (uint)fStack_260;
            auVar198._12_4_ = ~auVar197._12_4_ & (uint)fStack_25c;
            *(undefined1 (*) [16])(afStack_e8 + uVar69 * 0xc) = auVar198 | auVar117;
            afStack_d0[uVar69 * 0xc + -2] = local_3f8;
            afStack_d0[uVar69 * 0xc + -1] = fStack_3f4;
            fVar168 = (float)((int)local_490 + 1);
            pRVar68 = (RTCIntersectArguments *)(ulong)(uint)fVar168;
            afStack_d0[uVar69 * 0xc] = fVar168;
            uVar64 = (ulong)((int)uVar69 + 1);
          }
        }
      }
    }
    fVar120 = (ray->super_RayK<1>).tfar;
    fVar168 = local_3f8;
    fVar80 = fStack_3f4;
    uVar67 = uStack_3f0;
    uVar62 = uStack_3ec;
    do {
      uVar75 = (uint)uVar64;
      if (uVar75 == 0) {
        fVar168 = (ray->super_RayK<1>).tfar;
        auVar151._4_4_ = -(uint)(fStack_244 <= fVar168);
        auVar151._0_4_ = -(uint)(local_248 <= fVar168);
        auVar151._8_4_ = -(uint)(fStack_240 <= fVar168);
        auVar151._12_4_ = -(uint)(fStack_23c <= fVar168);
        uVar75 = movmskps((int)pRVar68,auVar151);
        uVar75 = (uint)local_2a0 - 1 & (uint)local_2a0 & uVar75;
        if (uVar75 == 0) {
          return;
        }
        goto LAB_00bb7a09;
      }
      uVar64 = (ulong)(uVar75 - 1);
      local_4e8.valid._0_4_ =
           -(uint)(local_3b8 + afStack_e8[uVar64 * 0xc] <= fVar120) & auStack_f8[uVar64 * 0xc];
      local_4e8.valid._4_4_ =
           -(uint)(fStack_3b4 + afStack_e8[uVar64 * 0xc + 1] <= fVar120) &
           auStack_f8[uVar64 * 0xc + 1];
      local_4e8.geometryUserPtr._0_4_ =
           -(uint)(fStack_3b0 + afStack_e8[uVar64 * 0xc + 2] <= fVar120) &
           auStack_f8[uVar64 * 0xc + 2];
      local_4e8.geometryUserPtr._4_4_ =
           -(uint)(fStack_3ac + afStack_e8[uVar64 * 0xc + 3] <= fVar120) &
           (uint)afStack_e8[uVar64 * 0xc + -1];
      uVar76 = movmskps((int)pRVar68,(undefined1  [16])local_4e8._0_16_);
      pRVar68 = (RTCIntersectArguments *)(ulong)uVar76;
      if (uVar76 != 0) {
        auVar164._0_4_ = (uint)afStack_e8[uVar64 * 0xc] & (uint)local_4e8.valid;
        auVar164._4_4_ = (uint)afStack_e8[uVar64 * 0xc + 1] & local_4e8.valid._4_4_;
        auVar164._8_4_ = (uint)afStack_e8[uVar64 * 0xc + 2] & (uint)local_4e8.geometryUserPtr;
        auVar164._12_4_ = (uint)afStack_e8[uVar64 * 0xc + 3] & local_4e8.geometryUserPtr._4_4_;
        auVar183._0_8_ =
             CONCAT44(~local_4e8.valid._4_4_,~(uint)local_4e8.valid) & 0x7f8000007f800000;
        auVar183._8_4_ = ~(uint)local_4e8.geometryUserPtr & 0x7f800000;
        auVar183._12_4_ = ~local_4e8.geometryUserPtr._4_4_ & 0x7f800000;
        auVar183 = auVar183 | auVar164;
        auVar199._4_4_ = auVar183._0_4_;
        auVar199._0_4_ = auVar183._4_4_;
        auVar199._8_4_ = auVar183._12_4_;
        auVar199._12_4_ = auVar183._8_4_;
        auVar82 = minps(auVar199,auVar183);
        auVar165._0_8_ = auVar82._8_8_;
        auVar165._8_4_ = auVar82._0_4_;
        auVar165._12_4_ = auVar82._4_4_;
        auVar82 = minps(auVar165,auVar82);
        auVar166._0_8_ =
             CONCAT44(-(uint)(auVar82._4_4_ == auVar183._4_4_) & local_4e8.valid._4_4_,
                      -(uint)(auVar82._0_4_ == auVar183._0_4_) & (uint)local_4e8.valid);
        auVar166._8_4_ = -(uint)(auVar82._8_4_ == auVar183._8_4_) & (uint)local_4e8.geometryUserPtr;
        auVar166._12_4_ =
             -(uint)(auVar82._12_4_ == auVar183._12_4_) & local_4e8.geometryUserPtr._4_4_;
        iVar61 = movmskps((int)lVar70,auVar166);
        auVar150 = (undefined1  [16])local_4e8._0_16_;
        if (iVar61 != 0) {
          auVar150._8_4_ = auVar166._8_4_;
          auVar150._0_8_ = auVar166._0_8_;
          auVar150._12_4_ = auVar166._12_4_;
        }
        fVar168 = afStack_d0[uVar64 * 0xc + -2];
        fVar80 = afStack_d0[uVar64 * 0xc + -1];
        local_490 = (ulong)(uint)afStack_d0[uVar64 * 0xc];
        uVar77 = movmskps(afStack_d0[uVar64 * 0xc],auVar150);
        lVar70 = 0;
        if (uVar77 != 0) {
          for (; (uVar77 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
          }
        }
        *(undefined4 *)((long)&local_4e8.valid + lVar70 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar64 * 0xc) = (undefined1  [16])local_4e8._0_16_;
        iVar61 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar64 * 0xc),
                          (undefined1  [16])local_4e8._0_16_);
        if (iVar61 == 0) {
          uVar75 = uVar75 - 1;
        }
        fVar80 = fVar80 - fVar168;
        local_458 = CONCAT44(fVar80 * 0.33333334 + fVar168,fVar80 * 0.0 + fVar168);
        fStack_450 = fVar80 * 0.6666667 + fVar168;
        fStack_44c = fVar80 * 1.0 + fVar168;
        fVar168 = *(float *)((long)&local_458 + lVar70 * 4);
        fVar80 = *(float *)((long)&local_458 + lVar70 * 4 + 4);
        uVar67 = 0;
        uVar62 = 0;
        uVar64 = (ulong)uVar75;
      }
      uVar69 = uVar64;
    } while ((char)uVar76 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }